

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersectorK<4,4>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined4 uVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [12];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  byte bVar50;
  byte bVar51;
  ulong uVar52;
  byte bVar53;
  ulong uVar54;
  byte bVar55;
  byte bVar56;
  long lVar57;
  bool bVar58;
  bool bVar59;
  ulong uVar60;
  uint uVar61;
  uint uVar118;
  uint uVar119;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  uint uVar121;
  uint uVar122;
  uint uVar123;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  uint uVar120;
  uint uVar124;
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar117 [32];
  float fVar125;
  float fVar147;
  vint4 bi_2;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [64];
  vint4 ai_2;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [64];
  vint4 bi;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  vint4 ai;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar210;
  float fVar216;
  float fVar217;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  undefined1 auVar215 [32];
  float fVar222;
  vint4 ai_1;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar227;
  float fVar228;
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [64];
  float t;
  float fVar232;
  float fVar233;
  float fVar238;
  undefined1 auVar234 [16];
  float fVar236;
  float fVar237;
  float fVar239;
  undefined1 auVar235 [64];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [64];
  float s;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  float local_920;
  undefined8 local_900;
  undefined8 uStack_8f8;
  ulong local_8e8;
  ulong local_8e0;
  uint local_8d4;
  uint local_8d0;
  undefined4 local_8cc;
  float local_8c8;
  float local_8c4;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  Primitive *local_720;
  ulong local_718;
  RTCFilterFunctionNArguments local_710;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  float local_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  RTCHitN local_500 [16];
  undefined1 auStack_4f0 [16];
  undefined4 local_4e0;
  undefined4 uStack_4dc;
  undefined4 uStack_4d8;
  undefined4 uStack_4d4;
  float local_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [16];
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [16];
  uint local_490;
  uint uStack_48c;
  uint uStack_488;
  uint uStack_484;
  uint uStack_480;
  uint uStack_47c;
  uint uStack_478;
  uint uStack_474;
  undefined1 local_460 [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_390 [16];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  byte local_180 [32];
  uint auStack_160 [8];
  float local_140 [2];
  uint local_138 [66];
  undefined1 auVar106 [32];
  undefined1 auVar113 [32];
  undefined1 auVar116 [32];
  
  PVar2 = prim[1];
  uVar60 = (ulong)(byte)PVar2;
  fVar210 = *(float *)(prim + uVar60 * 0x19 + 0x12);
  auVar69 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar69 = vinsertps_avx(auVar69,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar67 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar67 = vinsertps_avx(auVar67,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar69 = vsubps_avx(auVar69,*(undefined1 (*) [16])(prim + uVar60 * 0x19 + 6));
  auVar186._0_4_ = fVar210 * auVar69._0_4_;
  auVar186._4_4_ = fVar210 * auVar69._4_4_;
  auVar186._8_4_ = fVar210 * auVar69._8_4_;
  auVar186._12_4_ = fVar210 * auVar69._12_4_;
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 4 + 6)));
  auVar126._0_4_ = fVar210 * auVar67._0_4_;
  auVar126._4_4_ = fVar210 * auVar67._4_4_;
  auVar126._8_4_ = fVar210 * auVar67._8_4_;
  auVar126._12_4_ = fVar210 * auVar67._12_4_;
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar67 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 5 + 6)));
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar62 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 6 + 6)));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0xb + 6)));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6)));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar63 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar2 * 0xc + uVar60 + 6)));
  uVar52 = (ulong)(uint)((int)(uVar60 * 9) * 2);
  auVar234 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 + 6)));
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar234 = vcvtdq2ps_avx(auVar234);
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 + uVar60 + 6)));
  auVar71 = vcvtdq2ps_avx(auVar71);
  uVar54 = (ulong)(uint)((int)(uVar60 * 5) << 2);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar244._4_4_ = auVar126._0_4_;
  auVar244._0_4_ = auVar126._0_4_;
  auVar244._8_4_ = auVar126._0_4_;
  auVar244._12_4_ = auVar126._0_4_;
  auVar72 = vshufps_avx(auVar126,auVar126,0x55);
  auVar73 = vshufps_avx(auVar126,auVar126,0xaa);
  fVar210 = auVar73._0_4_;
  auVar200._0_4_ = fVar210 * auVar62._0_4_;
  fVar147 = auVar73._4_4_;
  auVar200._4_4_ = fVar147 * auVar62._4_4_;
  fVar216 = auVar73._8_4_;
  auVar200._8_4_ = fVar216 * auVar62._8_4_;
  fVar217 = auVar73._12_4_;
  auVar200._12_4_ = fVar217 * auVar62._12_4_;
  auVar148._0_4_ = auVar63._0_4_ * fVar210;
  auVar148._4_4_ = auVar63._4_4_ * fVar147;
  auVar148._8_4_ = auVar63._8_4_ * fVar216;
  auVar148._12_4_ = auVar63._12_4_ * fVar217;
  auVar127._0_4_ = auVar64._0_4_ * fVar210;
  auVar127._4_4_ = auVar64._4_4_ * fVar147;
  auVar127._8_4_ = auVar64._8_4_ * fVar216;
  auVar127._12_4_ = auVar64._12_4_ * fVar217;
  auVar73 = vfmadd231ps_fma(auVar200,auVar72,auVar67);
  auVar66 = vfmadd231ps_fma(auVar148,auVar72,auVar70);
  auVar72 = vfmadd231ps_fma(auVar127,auVar71,auVar72);
  auVar65 = vfmadd231ps_fma(auVar73,auVar244,auVar69);
  auVar66 = vfmadd231ps_fma(auVar66,auVar244,auVar68);
  auVar126 = vfmadd231ps_fma(auVar72,auVar234,auVar244);
  auVar245._4_4_ = auVar186._0_4_;
  auVar245._0_4_ = auVar186._0_4_;
  auVar245._8_4_ = auVar186._0_4_;
  auVar245._12_4_ = auVar186._0_4_;
  auVar72 = vshufps_avx(auVar186,auVar186,0x55);
  auVar73 = vshufps_avx(auVar186,auVar186,0xaa);
  auVar62 = vmulps_avx512vl(auVar73,auVar62);
  auVar187._0_4_ = auVar73._0_4_ * auVar63._0_4_;
  auVar187._4_4_ = auVar73._4_4_ * auVar63._4_4_;
  auVar187._8_4_ = auVar73._8_4_ * auVar63._8_4_;
  auVar187._12_4_ = auVar73._12_4_ * auVar63._12_4_;
  auVar169._0_4_ = auVar73._0_4_ * auVar64._0_4_;
  auVar169._4_4_ = auVar73._4_4_ * auVar64._4_4_;
  auVar169._8_4_ = auVar73._8_4_ * auVar64._8_4_;
  auVar169._12_4_ = auVar73._12_4_ * auVar64._12_4_;
  auVar63 = vfmadd231ps_avx512vl(auVar62,auVar72,auVar67);
  auVar67 = vfmadd231ps_fma(auVar187,auVar72,auVar70);
  auVar62 = vfmadd231ps_fma(auVar169,auVar72,auVar71);
  auVar64 = vfmadd231ps_avx512vl(auVar63,auVar245,auVar69);
  auVar63 = vfmadd231ps_fma(auVar67,auVar245,auVar68);
  auVar71 = vfmadd231ps_fma(auVar62,auVar245,auVar234);
  auVar223._8_4_ = 0x7fffffff;
  auVar223._0_8_ = 0x7fffffff7fffffff;
  auVar223._12_4_ = 0x7fffffff;
  auVar69 = vandps_avx(auVar65,auVar223);
  auVar211._8_4_ = 0x219392ef;
  auVar211._0_8_ = 0x219392ef219392ef;
  auVar211._12_4_ = 0x219392ef;
  uVar52 = vcmpps_avx512vl(auVar69,auVar211,1);
  bVar59 = (bool)((byte)uVar52 & 1);
  auVar73._0_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar65._0_4_;
  bVar59 = (bool)((byte)(uVar52 >> 1) & 1);
  auVar73._4_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar65._4_4_;
  bVar59 = (bool)((byte)(uVar52 >> 2) & 1);
  auVar73._8_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar65._8_4_;
  bVar59 = (bool)((byte)(uVar52 >> 3) & 1);
  auVar73._12_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar65._12_4_;
  auVar69 = vandps_avx(auVar66,auVar223);
  uVar52 = vcmpps_avx512vl(auVar69,auVar211,1);
  bVar59 = (bool)((byte)uVar52 & 1);
  auVar65._0_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar66._0_4_;
  bVar59 = (bool)((byte)(uVar52 >> 1) & 1);
  auVar65._4_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar66._4_4_;
  bVar59 = (bool)((byte)(uVar52 >> 2) & 1);
  auVar65._8_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar66._8_4_;
  bVar59 = (bool)((byte)(uVar52 >> 3) & 1);
  auVar65._12_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar66._12_4_;
  auVar69 = vandps_avx(auVar126,auVar223);
  uVar52 = vcmpps_avx512vl(auVar69,auVar211,1);
  bVar59 = (bool)((byte)uVar52 & 1);
  auVar66._0_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar126._0_4_;
  bVar59 = (bool)((byte)(uVar52 >> 1) & 1);
  auVar66._4_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar126._4_4_;
  bVar59 = (bool)((byte)(uVar52 >> 2) & 1);
  auVar66._8_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar126._8_4_;
  bVar59 = (bool)((byte)(uVar52 >> 3) & 1);
  auVar66._12_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar126._12_4_;
  auVar67 = vrcp14ps_avx512vl(auVar73);
  auVar212._8_4_ = 0x3f800000;
  auVar212._0_8_ = &DAT_3f8000003f800000;
  auVar212._12_4_ = 0x3f800000;
  auVar69 = vfnmadd213ps_fma(auVar73,auVar67,auVar212);
  auVar62 = vfmadd132ps_fma(auVar69,auVar67,auVar67);
  auVar67 = vrcp14ps_avx512vl(auVar65);
  auVar69 = vfnmadd213ps_fma(auVar65,auVar67,auVar212);
  auVar70 = vfmadd132ps_fma(auVar69,auVar67,auVar67);
  auVar67 = vrcp14ps_avx512vl(auVar66);
  auVar69 = vfnmadd213ps_fma(auVar66,auVar67,auVar212);
  auVar234 = vfmadd132ps_fma(auVar69,auVar67,auVar67);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar60 * 7 + 6);
  auVar69 = vpmovsxwd_avx(auVar69);
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar68 = vsubps_avx512vl(auVar69,auVar64);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *(ulong *)(prim + uVar60 * 9 + 6);
  auVar69 = vpmovsxwd_avx(auVar67);
  auVar208._0_4_ = auVar62._0_4_ * auVar68._0_4_;
  auVar208._4_4_ = auVar62._4_4_ * auVar68._4_4_;
  auVar208._8_4_ = auVar62._8_4_ * auVar68._8_4_;
  auVar208._12_4_ = auVar62._12_4_ * auVar68._12_4_;
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar69 = vsubps_avx512vl(auVar69,auVar64);
  auVar201._0_4_ = auVar62._0_4_ * auVar69._0_4_;
  auVar201._4_4_ = auVar62._4_4_ * auVar69._4_4_;
  auVar201._8_4_ = auVar62._8_4_ * auVar69._8_4_;
  auVar201._12_4_ = auVar62._12_4_ * auVar69._12_4_;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar67 = vpmovsxwd_avx(auVar62);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar60 * -2 + 6);
  auVar69 = vpmovsxwd_avx(auVar68);
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar69 = vsubps_avx(auVar69,auVar63);
  auVar224._0_4_ = auVar70._0_4_ * auVar69._0_4_;
  auVar224._4_4_ = auVar70._4_4_ * auVar69._4_4_;
  auVar224._8_4_ = auVar70._8_4_ * auVar69._8_4_;
  auVar224._12_4_ = auVar70._12_4_ * auVar69._12_4_;
  auVar69 = vcvtdq2ps_avx(auVar67);
  auVar69 = vsubps_avx(auVar69,auVar63);
  auVar149._0_4_ = auVar70._0_4_ * auVar69._0_4_;
  auVar149._4_4_ = auVar70._4_4_ * auVar69._4_4_;
  auVar149._8_4_ = auVar70._8_4_ * auVar69._8_4_;
  auVar149._12_4_ = auVar70._12_4_ * auVar69._12_4_;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar54 + uVar60 + 6);
  auVar69 = vpmovsxwd_avx(auVar70);
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar69 = vsubps_avx(auVar69,auVar71);
  auVar188._0_4_ = auVar234._0_4_ * auVar69._0_4_;
  auVar188._4_4_ = auVar234._4_4_ * auVar69._4_4_;
  auVar188._8_4_ = auVar234._8_4_ * auVar69._8_4_;
  auVar188._12_4_ = auVar234._12_4_ * auVar69._12_4_;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = *(ulong *)(prim + uVar60 * 0x17 + 6);
  auVar69 = vpmovsxwd_avx(auVar63);
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar69 = vsubps_avx(auVar69,auVar71);
  auVar128._0_4_ = auVar234._0_4_ * auVar69._0_4_;
  auVar128._4_4_ = auVar234._4_4_ * auVar69._4_4_;
  auVar128._8_4_ = auVar234._8_4_ * auVar69._8_4_;
  auVar128._12_4_ = auVar234._12_4_ * auVar69._12_4_;
  auVar69 = vpminsd_avx(auVar208,auVar201);
  auVar67 = vpminsd_avx(auVar224,auVar149);
  auVar69 = vmaxps_avx(auVar69,auVar67);
  auVar67 = vpminsd_avx(auVar188,auVar128);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar234._4_4_ = uVar1;
  auVar234._0_4_ = uVar1;
  auVar234._8_4_ = uVar1;
  auVar234._12_4_ = uVar1;
  auVar67 = vmaxps_avx512vl(auVar67,auVar234);
  auVar69 = vmaxps_avx(auVar69,auVar67);
  auVar71._8_4_ = 0x3f7ffffa;
  auVar71._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar71._12_4_ = 0x3f7ffffa;
  local_390 = vmulps_avx512vl(auVar69,auVar71);
  auVar69 = vpmaxsd_avx(auVar208,auVar201);
  auVar67 = vpmaxsd_avx(auVar224,auVar149);
  auVar69 = vminps_avx(auVar69,auVar67);
  auVar67 = vpmaxsd_avx(auVar188,auVar128);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar64._4_4_ = uVar1;
  auVar64._0_4_ = uVar1;
  auVar64._8_4_ = uVar1;
  auVar64._12_4_ = uVar1;
  auVar67 = vminps_avx512vl(auVar67,auVar64);
  auVar69 = vminps_avx(auVar69,auVar67);
  auVar72._8_4_ = 0x3f800003;
  auVar72._0_8_ = 0x3f8000033f800003;
  auVar72._12_4_ = 0x3f800003;
  auVar69 = vmulps_avx512vl(auVar69,auVar72);
  auVar67 = vpbroadcastd_avx512vl();
  uVar12 = vcmpps_avx512vl(local_390,auVar69,2);
  local_718 = vpcmpgtd_avx512vl(auVar67,_DAT_01ff0cf0);
  local_718 = ((byte)uVar12 & 0xf) & local_718;
  bVar58 = (char)local_718 == '\0';
  bVar59 = !bVar58;
  if (bVar58) {
    return bVar59;
  }
  local_530 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_720 = prim;
LAB_01b4f802:
  lVar57 = 0;
  for (uVar52 = local_718; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
    lVar57 = lVar57 + 1;
  }
  local_8e8 = (ulong)*(uint *)(prim + 2);
  pGVar3 = (context->scene->geometries).items[local_8e8].ptr;
  uVar52 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar57 * 4 + 6));
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar57 = *(long *)&pGVar3[1].time_range.upper;
  auVar69 = *(undefined1 (*) [16])(lVar57 + (long)p_Var4 * uVar52);
  auVar67 = *(undefined1 (*) [16])(lVar57 + (uVar52 + 1) * (long)p_Var4);
  local_718 = local_718 - 1 & local_718;
  if (local_718 != 0) {
    uVar54 = local_718 - 1 & local_718;
    for (uVar60 = local_718; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
    }
    if (uVar54 != 0) {
      for (; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar62 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar68 = vinsertps_avx(auVar62,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_840 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
  auVar255 = ZEXT3264(local_840);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar246._4_4_ = uVar1;
  auVar246._0_4_ = uVar1;
  auVar246._8_4_ = uVar1;
  auVar246._12_4_ = uVar1;
  local_460._16_4_ = uVar1;
  local_460._0_16_ = auVar246;
  local_460._20_4_ = uVar1;
  local_460._24_4_ = uVar1;
  local_460._28_4_ = uVar1;
  auVar62 = vunpcklps_avx512vl(local_840._0_16_,auVar246);
  fVar210 = *(float *)(ray + k * 4 + 0x60);
  auVar243._4_4_ = fVar210;
  auVar243._0_4_ = fVar210;
  auVar243._8_4_ = fVar210;
  auVar243._12_4_ = fVar210;
  local_340._16_4_ = fVar210;
  local_340._0_16_ = auVar243;
  local_340._20_4_ = fVar210;
  local_340._24_4_ = fVar210;
  local_340._28_4_ = fVar210;
  local_6b0 = vinsertps_avx(auVar62,auVar243,0x28);
  auVar235 = ZEXT1664(local_6b0);
  auVar209._0_4_ = auVar69._0_4_ + auVar67._0_4_;
  auVar209._4_4_ = auVar69._4_4_ + auVar67._4_4_;
  auVar209._8_4_ = auVar69._8_4_ + auVar67._8_4_;
  auVar209._12_4_ = auVar69._12_4_ + auVar67._12_4_;
  auVar16._8_4_ = 0x3f000000;
  auVar16._0_8_ = 0x3f0000003f000000;
  auVar16._12_4_ = 0x3f000000;
  auVar62 = vmulps_avx512vl(auVar209,auVar16);
  auVar62 = vsubps_avx(auVar62,auVar68);
  auVar62 = vdpps_avx(auVar62,local_6b0,0x7f);
  fVar147 = *(float *)(ray + k * 4 + 0x30);
  local_6c0 = vdpps_avx(local_6b0,local_6b0,0x7f);
  auVar242 = ZEXT1664(local_6c0);
  auVar213._4_12_ = ZEXT812(0) << 0x20;
  auVar213._0_4_ = local_6c0._0_4_;
  auVar63 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar213);
  auVar70 = vfnmadd213ss_fma(auVar63,local_6c0,ZEXT416(0x40000000));
  local_260 = auVar62._0_4_ * auVar63._0_4_ * auVar70._0_4_;
  auVar214._4_4_ = local_260;
  auVar214._0_4_ = local_260;
  auVar214._8_4_ = local_260;
  auVar214._12_4_ = local_260;
  fStack_430 = local_260;
  _local_440 = auVar214;
  fStack_42c = local_260;
  fStack_428 = local_260;
  fStack_424 = local_260;
  auVar62 = vfmadd231ps_fma(auVar68,local_6b0,auVar214);
  auVar62 = vblendps_avx(auVar62,ZEXT816(0) << 0x40,8);
  auVar69 = vsubps_avx(auVar69,auVar62);
  auVar68 = vsubps_avx(*(undefined1 (*) [16])(lVar57 + (uVar52 + 2) * (long)p_Var4),auVar62);
  auVar67 = vsubps_avx(auVar67,auVar62);
  auVar231 = ZEXT1664(auVar67);
  auVar62 = vsubps_avx(*(undefined1 (*) [16])(lVar57 + (uVar52 + 3) * (long)p_Var4),auVar62);
  local_860 = vbroadcastss_avx512vl(auVar69);
  auVar252 = ZEXT3264(local_860);
  auVar75._8_4_ = 1;
  auVar75._0_8_ = 0x100000001;
  auVar75._12_4_ = 1;
  auVar75._16_4_ = 1;
  auVar75._20_4_ = 1;
  auVar75._24_4_ = 1;
  auVar75._28_4_ = 1;
  local_640 = ZEXT1632(auVar69);
  local_740 = vpermps_avx512vl(auVar75,local_640);
  auVar250 = ZEXT3264(local_740);
  auVar74._8_4_ = 2;
  auVar74._0_8_ = 0x200000002;
  auVar74._12_4_ = 2;
  auVar74._16_4_ = 2;
  auVar74._20_4_ = 2;
  auVar74._24_4_ = 2;
  auVar74._28_4_ = 2;
  local_760 = vpermps_avx512vl(auVar74,local_640);
  auVar251 = ZEXT3264(local_760);
  auVar76._8_4_ = 3;
  auVar76._0_8_ = 0x300000003;
  auVar76._12_4_ = 3;
  auVar76._16_4_ = 3;
  auVar76._20_4_ = 3;
  auVar76._24_4_ = 3;
  auVar76._28_4_ = 3;
  local_880 = vpermps_avx512vl(auVar76,local_640);
  auVar253 = ZEXT3264(local_880);
  local_8a0 = vbroadcastss_avx512vl(auVar67);
  auVar256 = ZEXT3264(local_8a0);
  local_680 = ZEXT1632(auVar67);
  local_280 = vpermps_avx512vl(auVar75,local_680);
  local_8c0 = vpermps_avx512vl(auVar74,local_680);
  auVar254 = ZEXT3264(local_8c0);
  local_780 = vpermps_avx512vl(auVar76,local_680);
  auVar257 = ZEXT3264(local_780);
  local_7a0 = vbroadcastss_avx512vl(auVar68);
  auVar259 = ZEXT3264(local_7a0);
  local_660 = ZEXT1632(auVar68);
  local_6e0 = vpermps_avx512vl(auVar75,local_660);
  auVar258 = ZEXT3264(local_6e0);
  local_7c0 = vpermps_avx512vl(auVar74,local_660);
  auVar249 = ZEXT3264(local_7c0);
  local_1e0 = vpermps_avx2(auVar76,local_660);
  local_2a0 = auVar62._0_4_;
  _local_6a0 = ZEXT1632(auVar62);
  local_2c0 = vpermps_avx512vl(auVar75,_local_6a0);
  _local_200 = vpermps_avx2(auVar74,_local_6a0);
  local_220 = vpermps_avx2(auVar76,_local_6a0);
  auVar69 = vfmadd231ps_fma(ZEXT432((uint)(fVar210 * fVar210)),local_460,local_460);
  local_360 = vfmadd231ps_avx512vl(ZEXT1632(auVar69),local_840,local_840);
  local_240._0_4_ = local_360._0_4_;
  local_240._4_4_ = local_240._0_4_;
  local_240._8_4_ = local_240._0_4_;
  local_240._12_4_ = local_240._0_4_;
  local_240._16_4_ = local_240._0_4_;
  local_240._20_4_ = local_240._0_4_;
  local_240._24_4_ = local_240._0_4_;
  local_240._28_4_ = local_240._0_4_;
  auVar77._8_4_ = 0x7fffffff;
  auVar77._0_8_ = 0x7fffffff7fffffff;
  auVar77._12_4_ = 0x7fffffff;
  auVar77._16_4_ = 0x7fffffff;
  auVar77._20_4_ = 0x7fffffff;
  auVar77._24_4_ = 0x7fffffff;
  auVar77._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_240,auVar77);
  local_600 = ZEXT416((uint)local_260);
  local_260 = fVar147 - local_260;
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  local_510 = vpbroadcastd_avx512vl();
  local_8e0 = 1;
  uVar52 = 0;
  bVar55 = 0;
  local_520 = vpbroadcastd_avx512vl();
  auVar69 = vsqrtss_avx(local_6c0,local_6c0);
  local_8c4 = auVar69._0_4_;
  auVar69 = vsqrtss_avx(local_6c0,local_6c0);
  local_8c8 = auVar69._0_4_;
  local_620 = ZEXT816(0x3f80000000000000);
  auVar199 = ZEXT3264(_DAT_02020f20);
  auVar185 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  fStack_29c = local_2a0;
  fStack_298 = local_2a0;
  fStack_294 = local_2a0;
  fStack_290 = local_2a0;
  fStack_28c = local_2a0;
  fStack_288 = local_2a0;
  fStack_284 = local_2a0;
  do {
    auVar69 = vmovshdup_avx(local_620);
    local_820._0_4_ = local_620._0_4_;
    fVar210 = auVar69._0_4_ - local_820._0_4_;
    fVar221 = fVar210 * 0.04761905;
    local_820._4_4_ = local_820._0_4_;
    local_820._8_4_ = local_820._0_4_;
    local_820._12_4_ = local_820._0_4_;
    local_820._16_4_ = local_820._0_4_;
    local_820._20_4_ = local_820._0_4_;
    local_820._24_4_ = local_820._0_4_;
    local_820._28_4_ = local_820._0_4_;
    auVar137._4_4_ = fVar210;
    auVar137._0_4_ = fVar210;
    auVar137._8_4_ = fVar210;
    auVar137._12_4_ = fVar210;
    auVar137._16_4_ = fVar210;
    auVar137._20_4_ = fVar210;
    auVar137._24_4_ = fVar210;
    auVar137._28_4_ = fVar210;
    auVar69 = vfmadd231ps_fma(local_820,auVar137,auVar199._0_32_);
    auVar77 = vsubps_avx(auVar185._0_32_,ZEXT1632(auVar69));
    fVar210 = auVar69._0_4_;
    fVar216 = auVar69._4_4_;
    fVar217 = auVar69._8_4_;
    fVar218 = auVar69._12_4_;
    fVar219 = auVar77._0_4_;
    fVar220 = auVar77._4_4_;
    fVar239 = auVar77._8_4_;
    fVar222 = auVar77._12_4_;
    fVar125 = auVar77._16_4_;
    fVar227 = auVar77._20_4_;
    fVar228 = auVar77._24_4_;
    auVar84._4_4_ = fVar220 * fVar220 * -fVar216;
    auVar84._0_4_ = fVar219 * fVar219 * -fVar210;
    auVar84._8_4_ = fVar239 * fVar239 * -fVar217;
    auVar84._12_4_ = fVar222 * fVar222 * -fVar218;
    auVar84._16_4_ = fVar125 * fVar125 * -0.0;
    auVar84._20_4_ = fVar227 * fVar227 * -0.0;
    auVar84._24_4_ = fVar228 * fVar228 * -0.0;
    auVar84._28_4_ = 0x80000000;
    auVar74 = vmulps_avx512vl(ZEXT1632(auVar69),ZEXT1632(auVar69));
    fVar232 = fVar210 * 3.0;
    fVar236 = fVar216 * 3.0;
    fVar237 = fVar217 * 3.0;
    fVar238 = fVar218 * 3.0;
    auVar185._28_36_ = auVar235._28_36_;
    auVar185._0_28_ = ZEXT1628(CONCAT412(fVar238,CONCAT48(fVar237,CONCAT44(fVar236,fVar232))));
    auVar240._0_4_ = fVar232 + -5.0;
    auVar240._4_4_ = fVar236 + -5.0;
    auVar240._8_4_ = fVar237 + -5.0;
    auVar240._12_4_ = fVar238 + -5.0;
    auVar240._16_4_ = 0xc0a00000;
    auVar240._20_4_ = 0xc0a00000;
    auVar240._24_4_ = 0xc0a00000;
    auVar240._28_4_ = auVar235._28_4_ + -5.0;
    auVar75 = vmulps_avx512vl(auVar74,auVar240);
    auVar164._0_4_ = auVar75._0_4_ + 2.0;
    auVar164._4_4_ = auVar75._4_4_ + 2.0;
    auVar164._8_4_ = auVar75._8_4_ + 2.0;
    auVar164._12_4_ = auVar75._12_4_ + 2.0;
    auVar164._16_4_ = auVar75._16_4_ + 2.0;
    auVar164._20_4_ = auVar75._20_4_ + 2.0;
    auVar164._24_4_ = auVar75._24_4_ + 2.0;
    auVar164._28_4_ = auVar75._28_4_ + 2.0;
    auVar199._0_4_ = fVar219 * fVar219;
    auVar199._4_4_ = fVar220 * fVar220;
    auVar199._8_4_ = fVar239 * fVar239;
    auVar199._12_4_ = fVar222 * fVar222;
    auVar199._16_4_ = fVar125 * fVar125;
    auVar199._20_4_ = fVar227 * fVar227;
    auVar199._28_36_ = auVar242._28_36_;
    auVar199._24_4_ = fVar228 * fVar228;
    auVar183._0_4_ = auVar199._0_4_ * (fVar219 * 3.0 + -5.0) + 2.0;
    auVar183._4_4_ = auVar199._4_4_ * (fVar220 * 3.0 + -5.0) + 2.0;
    auVar183._8_4_ = auVar199._8_4_ * (fVar239 * 3.0 + -5.0) + 2.0;
    auVar183._12_4_ = auVar199._12_4_ * (fVar222 * 3.0 + -5.0) + 2.0;
    auVar183._16_4_ = auVar199._16_4_ * (fVar125 * 3.0 + -5.0) + 2.0;
    auVar183._20_4_ = auVar199._20_4_ * (fVar227 * 3.0 + -5.0) + 2.0;
    auVar183._24_4_ = auVar199._24_4_ * (fVar228 * 3.0 + -5.0) + 2.0;
    auVar183._28_4_ = auVar231._28_4_ + -5.0 + 2.0;
    fVar233 = auVar77._28_4_;
    auVar85._4_4_ = fVar216 * fVar216 * -fVar220;
    auVar85._0_4_ = fVar210 * fVar210 * -fVar219;
    auVar85._8_4_ = fVar217 * fVar217 * -fVar239;
    auVar85._12_4_ = fVar218 * fVar218 * -fVar222;
    auVar85._16_4_ = -fVar125 * 0.0 * 0.0;
    auVar85._20_4_ = -fVar227 * 0.0 * 0.0;
    auVar85._24_4_ = -fVar228 * 0.0 * 0.0;
    auVar85._28_4_ = -fVar233;
    auVar76 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar77 = vmulps_avx512vl(auVar84,auVar76);
    auVar75 = vmulps_avx512vl(auVar164,auVar76);
    auVar78 = vmulps_avx512vl(auVar183,auVar76);
    auVar79 = vmulps_avx512vl(auVar85,auVar76);
    auVar86._4_4_ = fStack_29c * auVar79._4_4_;
    auVar86._0_4_ = local_2a0 * auVar79._0_4_;
    auVar86._8_4_ = fStack_298 * auVar79._8_4_;
    auVar86._12_4_ = fStack_294 * auVar79._12_4_;
    auVar86._16_4_ = fStack_290 * auVar79._16_4_;
    auVar86._20_4_ = fStack_28c * auVar79._20_4_;
    auVar86._24_4_ = fStack_288 * auVar79._24_4_;
    auVar86._28_4_ = 0x80000000;
    auVar80 = vmulps_avx512vl(local_2c0,auVar79);
    auVar87._4_4_ = (float)local_200._4_4_ * auVar79._4_4_;
    auVar87._0_4_ = (float)local_200._0_4_ * auVar79._0_4_;
    auVar87._8_4_ = fStack_1f8 * auVar79._8_4_;
    auVar87._12_4_ = fStack_1f4 * auVar79._12_4_;
    auVar87._16_4_ = fStack_1f0 * auVar79._16_4_;
    auVar87._20_4_ = fStack_1ec * auVar79._20_4_;
    auVar87._24_4_ = fStack_1e8 * auVar79._24_4_;
    auVar87._28_4_ = auVar164._28_4_;
    auVar79 = vmulps_avx512vl(local_220,auVar79);
    auVar81 = vfmadd231ps_avx512vl(auVar86,auVar78,auVar259._0_32_);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar78,auVar258._0_32_);
    auVar82 = vfmadd231ps_avx512vl(auVar87,auVar78,auVar249._0_32_);
    auVar78 = vfmadd231ps_avx512vl(auVar79,local_1e0,auVar78);
    auVar79 = vfmadd231ps_avx512vl(auVar81,auVar75,auVar256._0_32_);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar75,local_280);
    auVar81 = vfmadd231ps_avx512vl(auVar82,auVar75,auVar254._0_32_);
    auVar78 = vfmadd231ps_avx512vl(auVar78,auVar257._0_32_,auVar75);
    local_800 = vfmadd231ps_avx512vl(auVar79,auVar77,auVar252._0_32_);
    local_560 = vfmadd231ps_avx512vl(auVar80,auVar77,auVar250._0_32_);
    local_7e0 = vfmadd231ps_avx512vl(auVar81,auVar77,auVar251._0_32_);
    auVar79 = vfmadd231ps_avx512vl(auVar78,auVar253._0_32_,auVar77);
    auVar90._4_4_ = (fVar220 + fVar220) * fVar216;
    auVar90._0_4_ = (fVar219 + fVar219) * fVar210;
    auVar90._8_4_ = (fVar239 + fVar239) * fVar217;
    auVar90._12_4_ = (fVar222 + fVar222) * fVar218;
    auVar90._16_4_ = (fVar125 + fVar125) * 0.0;
    auVar90._20_4_ = (fVar227 + fVar227) * 0.0;
    auVar90._24_4_ = (fVar228 + fVar228) * 0.0;
    auVar90._28_4_ = auVar75._28_4_;
    auVar77 = vsubps_avx(auVar90,auVar199._0_32_);
    auVar204._0_28_ =
         ZEXT1628(CONCAT412((fVar218 + fVar218) * auVar240._12_4_ + fVar238 * fVar218,
                            CONCAT48((fVar217 + fVar217) * auVar240._8_4_ + fVar237 * fVar217,
                                     CONCAT44((fVar216 + fVar216) * auVar240._4_4_ +
                                              fVar236 * fVar216,
                                              (fVar210 + fVar210) * auVar240._0_4_ +
                                              fVar232 * fVar210))));
    auVar204._28_4_ = auVar240._28_4_ + 0.0;
    auVar78._8_4_ = 0x40000000;
    auVar78._0_8_ = 0x4000000040000000;
    auVar78._12_4_ = 0x40000000;
    auVar78._16_4_ = 0x40000000;
    auVar78._20_4_ = 0x40000000;
    auVar78._24_4_ = 0x40000000;
    auVar78._28_4_ = 0x40000000;
    auVar75 = vaddps_avx512vl(auVar185._0_32_,auVar78);
    auVar91._4_4_ = (fVar220 + fVar220) * auVar75._4_4_;
    auVar91._0_4_ = (fVar219 + fVar219) * auVar75._0_4_;
    auVar91._8_4_ = (fVar239 + fVar239) * auVar75._8_4_;
    auVar91._12_4_ = (fVar222 + fVar222) * auVar75._12_4_;
    auVar91._16_4_ = (fVar125 + fVar125) * auVar75._16_4_;
    auVar91._20_4_ = (fVar227 + fVar227) * auVar75._20_4_;
    auVar91._24_4_ = (fVar228 + fVar228) * auVar75._24_4_;
    auVar91._28_4_ = auVar75._28_4_;
    auVar92._4_4_ = fVar220 * 3.0 * fVar220;
    auVar92._0_4_ = fVar219 * 3.0 * fVar219;
    auVar92._8_4_ = fVar239 * 3.0 * fVar239;
    auVar92._12_4_ = fVar222 * 3.0 * fVar222;
    auVar92._16_4_ = fVar125 * 3.0 * fVar125;
    auVar92._20_4_ = fVar227 * 3.0 * fVar227;
    auVar92._24_4_ = fVar228 * 3.0 * fVar228;
    auVar92._28_4_ = fVar233;
    auVar75 = vsubps_avx(auVar91,auVar92);
    auVar74 = vsubps_avx512vl(auVar74,auVar90);
    auVar78 = vmulps_avx512vl(auVar77,auVar76);
    auVar80 = vmulps_avx512vl(auVar204,auVar76);
    auVar75 = vmulps_avx512vl(auVar75,auVar76);
    auVar74 = vmulps_avx512vl(auVar74,auVar76);
    fVar210 = auVar74._0_4_;
    fVar216 = auVar74._4_4_;
    auVar93._4_4_ = fStack_29c * fVar216;
    auVar93._0_4_ = local_2a0 * fVar210;
    fVar217 = auVar74._8_4_;
    auVar93._8_4_ = fStack_298 * fVar217;
    fVar218 = auVar74._12_4_;
    auVar93._12_4_ = fStack_294 * fVar218;
    fVar219 = auVar74._16_4_;
    auVar93._16_4_ = fStack_290 * fVar219;
    fVar220 = auVar74._20_4_;
    auVar93._20_4_ = fStack_28c * fVar220;
    fVar239 = auVar74._24_4_;
    auVar93._24_4_ = fStack_288 * fVar239;
    auVar93._28_4_ = auVar240._28_4_;
    auVar94._4_4_ = fVar216 * local_2c0._4_4_;
    auVar94._0_4_ = fVar210 * local_2c0._0_4_;
    auVar94._8_4_ = fVar217 * local_2c0._8_4_;
    auVar94._12_4_ = fVar218 * local_2c0._12_4_;
    auVar94._16_4_ = fVar219 * local_2c0._16_4_;
    auVar94._20_4_ = fVar220 * local_2c0._20_4_;
    auVar94._24_4_ = fVar239 * local_2c0._24_4_;
    auVar94._28_4_ = fStack_284;
    auVar95._4_4_ = fVar216 * (float)local_200._4_4_;
    auVar95._0_4_ = fVar210 * (float)local_200._0_4_;
    auVar95._8_4_ = fVar217 * fStack_1f8;
    auVar95._12_4_ = fVar218 * fStack_1f4;
    auVar95._16_4_ = fVar219 * fStack_1f0;
    auVar95._20_4_ = fVar220 * fStack_1ec;
    auVar95._24_4_ = fVar239 * fStack_1e8;
    auVar95._28_4_ = fVar233 + fVar233;
    auVar74 = vmulps_avx512vl(local_220,auVar74);
    auVar76 = vfmadd231ps_avx512vl(auVar93,auVar75,auVar259._0_32_);
    auVar81 = vfmadd231ps_avx512vl(auVar94,auVar75,auVar258._0_32_);
    auVar82 = vfmadd231ps_avx512vl(auVar95,auVar75,auVar249._0_32_);
    auVar75 = vfmadd231ps_avx512vl(auVar74,local_1e0,auVar75);
    auVar74 = vfmadd231ps_avx512vl(auVar76,auVar80,auVar256._0_32_);
    auVar76 = vfmadd231ps_avx512vl(auVar81,auVar80,local_280);
    auVar81 = vfmadd231ps_avx512vl(auVar82,auVar80,auVar254._0_32_);
    auVar75 = vfmadd231ps_avx512vl(auVar75,auVar257._0_32_,auVar80);
    auVar74 = vfmadd231ps_avx512vl(auVar74,auVar78,auVar252._0_32_);
    auVar76 = vfmadd231ps_avx512vl(auVar76,auVar78,auVar250._0_32_);
    auVar80 = vfmadd231ps_avx512vl(auVar81,auVar78,auVar251._0_32_);
    auVar75 = vfmadd231ps_avx512vl(auVar75,auVar253._0_32_,auVar78);
    auVar101._4_4_ = auVar74._4_4_ * fVar221;
    auVar101._0_4_ = auVar74._0_4_ * fVar221;
    auVar101._8_4_ = auVar74._8_4_ * fVar221;
    auVar101._12_4_ = auVar74._12_4_ * fVar221;
    auVar101._16_4_ = auVar74._16_4_ * fVar221;
    auVar101._20_4_ = auVar74._20_4_ * fVar221;
    auVar101._24_4_ = auVar74._24_4_ * fVar221;
    auVar101._28_4_ = auVar77._28_4_;
    auVar102._4_4_ = auVar76._4_4_ * fVar221;
    auVar102._0_4_ = auVar76._0_4_ * fVar221;
    auVar102._8_4_ = auVar76._8_4_ * fVar221;
    auVar102._12_4_ = auVar76._12_4_ * fVar221;
    auVar102._16_4_ = auVar76._16_4_ * fVar221;
    auVar102._20_4_ = auVar76._20_4_ * fVar221;
    auVar102._24_4_ = auVar76._24_4_ * fVar221;
    auVar102._28_4_ = auVar76._28_4_;
    auVar103._4_4_ = auVar80._4_4_ * fVar221;
    auVar103._0_4_ = auVar80._0_4_ * fVar221;
    auVar103._8_4_ = auVar80._8_4_ * fVar221;
    auVar103._12_4_ = auVar80._12_4_ * fVar221;
    auVar103._16_4_ = auVar80._16_4_ * fVar221;
    auVar103._20_4_ = auVar80._20_4_ * fVar221;
    auVar103._24_4_ = auVar80._24_4_ * fVar221;
    auVar103._28_4_ = auVar80._28_4_;
    fVar210 = auVar75._0_4_ * fVar221;
    fVar216 = auVar75._4_4_ * fVar221;
    auVar96._4_4_ = fVar216;
    auVar96._0_4_ = fVar210;
    fVar217 = auVar75._8_4_ * fVar221;
    auVar96._8_4_ = fVar217;
    fVar218 = auVar75._12_4_ * fVar221;
    auVar96._12_4_ = fVar218;
    fVar219 = auVar75._16_4_ * fVar221;
    auVar96._16_4_ = fVar219;
    fVar220 = auVar75._20_4_ * fVar221;
    auVar96._20_4_ = fVar220;
    fVar221 = auVar75._24_4_ * fVar221;
    auVar96._24_4_ = fVar221;
    auVar96._28_4_ = fStack_1e4;
    auVar69 = vxorps_avx512vl(auVar259._0_16_,auVar259._0_16_);
    auVar78 = vpermt2ps_avx512vl(local_800,_DAT_0205fd20,ZEXT1632(auVar69));
    auVar231 = ZEXT3264(auVar78);
    auVar83 = vpermt2ps_avx512vl(local_560,_DAT_0205fd20,ZEXT1632(auVar69));
    auVar74 = ZEXT1632(auVar69);
    auVar84 = vpermt2ps_avx512vl(local_7e0,_DAT_0205fd20,auVar74);
    auVar205._0_4_ = auVar79._0_4_ + fVar210;
    auVar205._4_4_ = auVar79._4_4_ + fVar216;
    auVar205._8_4_ = auVar79._8_4_ + fVar217;
    auVar205._12_4_ = auVar79._12_4_ + fVar218;
    auVar205._16_4_ = auVar79._16_4_ + fVar219;
    auVar205._20_4_ = auVar79._20_4_ + fVar220;
    auVar205._24_4_ = auVar79._24_4_ + fVar221;
    auVar205._28_4_ = auVar79._28_4_ + fStack_1e4;
    auVar77 = vmaxps_avx(auVar79,auVar205);
    auVar75 = vminps_avx(auVar79,auVar205);
    auVar80 = vpermt2ps_avx512vl(auVar79,_DAT_0205fd20,auVar74);
    auVar85 = vpermt2ps_avx512vl(auVar101,_DAT_0205fd20,auVar74);
    auVar86 = vpermt2ps_avx512vl(auVar102,_DAT_0205fd20,auVar74);
    auVar164 = ZEXT1632(auVar69);
    auVar87 = vpermt2ps_avx512vl(auVar103,_DAT_0205fd20,auVar164);
    auVar74 = vpermt2ps_avx512vl(auVar96,_DAT_0205fd20,auVar164);
    auVar81 = vsubps_avx512vl(auVar80,auVar74);
    auVar74 = vsubps_avx(auVar78,local_800);
    auVar76 = vsubps_avx(auVar83,local_560);
    local_580 = vsubps_avx512vl(auVar84,local_7e0);
    auVar79 = vmulps_avx512vl(auVar76,auVar103);
    auVar79 = vfmsub231ps_avx512vl(auVar79,auVar102,local_580);
    auVar82 = vmulps_avx512vl(local_580,auVar101);
    auVar82 = vfmsub231ps_avx512vl(auVar82,auVar103,auVar74);
    auVar88 = vmulps_avx512vl(auVar74,auVar102);
    auVar88 = vfmsub231ps_avx512vl(auVar88,auVar101,auVar76);
    auVar88 = vmulps_avx512vl(auVar88,auVar88);
    auVar82 = vfmadd231ps_avx512vl(auVar88,auVar82,auVar82);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar79,auVar79);
    auVar79 = vmulps_avx512vl(local_580,local_580);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar76,auVar76);
    auVar88 = vfmadd231ps_avx512vl(auVar79,auVar74,auVar74);
    auVar89 = vrcp14ps_avx512vl(auVar88);
    auVar79._8_4_ = 0x3f800000;
    auVar79._0_8_ = &DAT_3f8000003f800000;
    auVar79._12_4_ = 0x3f800000;
    auVar79._16_4_ = 0x3f800000;
    auVar79._20_4_ = 0x3f800000;
    auVar79._24_4_ = 0x3f800000;
    auVar79._28_4_ = 0x3f800000;
    auVar79 = vfnmadd213ps_avx512vl(auVar89,auVar88,auVar79);
    auVar79 = vfmadd132ps_avx512vl(auVar79,auVar89,auVar89);
    auVar82 = vmulps_avx512vl(auVar82,auVar79);
    auVar89 = vmulps_avx512vl(auVar76,auVar87);
    auVar89 = vfmsub231ps_avx512vl(auVar89,auVar86,local_580);
    auVar90 = vmulps_avx512vl(local_580,auVar85);
    auVar90 = vfmsub231ps_avx512vl(auVar90,auVar87,auVar74);
    auVar91 = vmulps_avx512vl(auVar74,auVar86);
    auVar91 = vfmsub231ps_avx512vl(auVar91,auVar85,auVar76);
    auVar91 = vmulps_avx512vl(auVar91,auVar91);
    auVar90 = vfmadd231ps_avx512vl(auVar91,auVar90,auVar90);
    auVar89 = vfmadd231ps_avx512vl(auVar90,auVar89,auVar89);
    auVar79 = vmulps_avx512vl(auVar89,auVar79);
    auVar79 = vmaxps_avx512vl(auVar82,auVar79);
    auVar79 = vsqrtps_avx512vl(auVar79);
    auVar82 = vmaxps_avx512vl(auVar81,auVar80);
    auVar77 = vmaxps_avx512vl(auVar77,auVar82);
    auVar82 = vaddps_avx512vl(auVar79,auVar77);
    auVar77 = vminps_avx512vl(auVar81,auVar80);
    auVar77 = vminps_avx(auVar75,auVar77);
    auVar77 = vsubps_avx512vl(auVar77,auVar79);
    auVar80._8_4_ = 0x3f800002;
    auVar80._0_8_ = 0x3f8000023f800002;
    auVar80._12_4_ = 0x3f800002;
    auVar80._16_4_ = 0x3f800002;
    auVar80._20_4_ = 0x3f800002;
    auVar80._24_4_ = 0x3f800002;
    auVar80._28_4_ = 0x3f800002;
    auVar75 = vmulps_avx512vl(auVar82,auVar80);
    auVar81._8_4_ = 0x3f7ffffc;
    auVar81._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar81._12_4_ = 0x3f7ffffc;
    auVar81._16_4_ = 0x3f7ffffc;
    auVar81._20_4_ = 0x3f7ffffc;
    auVar81._24_4_ = 0x3f7ffffc;
    auVar81._28_4_ = 0x3f7ffffc;
    auVar79 = vmulps_avx512vl(auVar77,auVar81);
    auVar97._4_4_ = auVar75._4_4_ * auVar75._4_4_;
    auVar97._0_4_ = auVar75._0_4_ * auVar75._0_4_;
    auVar97._8_4_ = auVar75._8_4_ * auVar75._8_4_;
    auVar97._12_4_ = auVar75._12_4_ * auVar75._12_4_;
    auVar97._16_4_ = auVar75._16_4_ * auVar75._16_4_;
    auVar97._20_4_ = auVar75._20_4_ * auVar75._20_4_;
    auVar97._24_4_ = auVar75._24_4_ * auVar75._24_4_;
    auVar97._28_4_ = auVar79._28_4_;
    auVar77 = vrsqrt14ps_avx512vl(auVar88);
    auVar82._8_4_ = 0xbf000000;
    auVar82._0_8_ = 0xbf000000bf000000;
    auVar82._12_4_ = 0xbf000000;
    auVar82._16_4_ = 0xbf000000;
    auVar82._20_4_ = 0xbf000000;
    auVar82._24_4_ = 0xbf000000;
    auVar82._28_4_ = 0xbf000000;
    auVar75 = vmulps_avx512vl(auVar88,auVar82);
    auVar98._4_4_ = auVar77._4_4_ * auVar75._4_4_;
    auVar98._0_4_ = auVar77._0_4_ * auVar75._0_4_;
    auVar98._8_4_ = auVar77._8_4_ * auVar75._8_4_;
    auVar98._12_4_ = auVar77._12_4_ * auVar75._12_4_;
    auVar98._16_4_ = auVar77._16_4_ * auVar75._16_4_;
    auVar98._20_4_ = auVar77._20_4_ * auVar75._20_4_;
    auVar98._24_4_ = auVar77._24_4_ * auVar75._24_4_;
    auVar98._28_4_ = auVar75._28_4_;
    auVar75 = vmulps_avx512vl(auVar77,auVar77);
    auVar75 = vmulps_avx512vl(auVar75,auVar98);
    auVar88._8_4_ = 0x3fc00000;
    auVar88._0_8_ = 0x3fc000003fc00000;
    auVar88._12_4_ = 0x3fc00000;
    auVar88._16_4_ = 0x3fc00000;
    auVar88._20_4_ = 0x3fc00000;
    auVar88._24_4_ = 0x3fc00000;
    auVar88._28_4_ = 0x3fc00000;
    auVar80 = vfmadd231ps_avx512vl(auVar75,auVar77,auVar88);
    auVar105._4_4_ = auVar80._4_4_ * auVar74._4_4_;
    auVar105._0_4_ = auVar80._0_4_ * auVar74._0_4_;
    auVar105._8_4_ = auVar80._8_4_ * auVar74._8_4_;
    auVar105._12_4_ = auVar80._12_4_ * auVar74._12_4_;
    auVar105._16_4_ = auVar80._16_4_ * auVar74._16_4_;
    auVar105._20_4_ = auVar80._20_4_ * auVar74._20_4_;
    auVar105._24_4_ = auVar80._24_4_ * auVar74._24_4_;
    auVar105._28_4_ = auVar77._28_4_;
    auVar77 = vmulps_avx512vl(auVar76,auVar80);
    auVar75 = vmulps_avx512vl(local_580,auVar80);
    auVar81 = vsubps_avx512vl(auVar164,local_800);
    auVar82 = vsubps_avx512vl(auVar164,local_560);
    auVar88 = vsubps_avx512vl(auVar164,local_7e0);
    auVar89 = vmulps_avx512vl(local_340,auVar88);
    auVar89 = vfmadd231ps_avx512vl(auVar89,local_460,auVar82);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar255._0_32_,auVar81);
    auVar90 = vmulps_avx512vl(auVar88,auVar88);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar82,auVar82);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar81,auVar81);
    auVar91 = vmulps_avx512vl(local_340,auVar75);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar77,local_460);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar105,auVar255._0_32_);
    auVar75 = vmulps_avx512vl(auVar88,auVar75);
    auVar77 = vfmadd231ps_avx512vl(auVar75,auVar82,auVar77);
    auVar92 = vfmadd231ps_avx512vl(auVar77,auVar81,auVar105);
    auVar93 = vmulps_avx512vl(auVar91,auVar91);
    auVar77 = vsubps_avx(local_240,auVar93);
    auVar75 = vmulps_avx512vl(auVar91,auVar92);
    auVar75 = vsubps_avx512vl(auVar89,auVar75);
    auVar94 = vaddps_avx512vl(auVar75,auVar75);
    auVar75 = vmulps_avx512vl(auVar92,auVar92);
    auVar90 = vsubps_avx512vl(auVar90,auVar75);
    auVar75 = vsubps_avx(auVar90,auVar97);
    auVar95 = vmulps_avx512vl(auVar94,auVar94);
    auVar89._8_4_ = 0x40800000;
    auVar89._0_8_ = 0x4080000040800000;
    auVar89._12_4_ = 0x40800000;
    auVar89._16_4_ = 0x40800000;
    auVar89._20_4_ = 0x40800000;
    auVar89._24_4_ = 0x40800000;
    auVar89._28_4_ = 0x40800000;
    auVar89 = vmulps_avx512vl(auVar77,auVar89);
    auVar96 = vmulps_avx512vl(auVar89,auVar75);
    auVar96 = vsubps_avx512vl(auVar95,auVar96);
    uVar60 = vcmpps_avx512vl(auVar96,auVar164,5);
    bVar53 = (byte)uVar60;
    if (bVar53 == 0) {
      auVar99 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar100 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar96 = vsqrtps_avx512vl(auVar96);
      auVar97 = vaddps_avx512vl(auVar77,auVar77);
      auVar98 = vrcp14ps_avx512vl(auVar97);
      auVar22._8_4_ = 0x3f800000;
      auVar22._0_8_ = &DAT_3f8000003f800000;
      auVar22._12_4_ = 0x3f800000;
      auVar22._16_4_ = 0x3f800000;
      auVar22._20_4_ = 0x3f800000;
      auVar22._24_4_ = 0x3f800000;
      auVar22._28_4_ = 0x3f800000;
      auVar97 = vfnmadd213ps_avx512vl(auVar97,auVar98,auVar22);
      auVar97 = vfmadd132ps_avx512vl(auVar97,auVar98,auVar98);
      auVar23._8_4_ = 0x80000000;
      auVar23._0_8_ = 0x8000000080000000;
      auVar23._12_4_ = 0x80000000;
      auVar23._16_4_ = 0x80000000;
      auVar23._20_4_ = 0x80000000;
      auVar23._24_4_ = 0x80000000;
      auVar23._28_4_ = 0x80000000;
      auVar98 = vxorps_avx512vl(auVar94,auVar23);
      auVar98 = vsubps_avx512vl(auVar98,auVar96);
      auVar98 = vmulps_avx512vl(auVar98,auVar97);
      auVar96 = vsubps_avx512vl(auVar96,auVar94);
      auVar96 = vmulps_avx512vl(auVar96,auVar97);
      auVar97 = vfmadd213ps_avx512vl(auVar91,auVar98,auVar92);
      local_3c0 = vmulps_avx512vl(auVar80,auVar97);
      auVar97 = vfmadd213ps_avx512vl(auVar91,auVar96,auVar92);
      local_3e0 = vmulps_avx512vl(auVar80,auVar97);
      auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar97 = vblendmps_avx512vl(auVar97,auVar98);
      auVar99._0_4_ =
           (uint)(bVar53 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar53 & 1) * local_3e0._0_4_;
      bVar58 = (bool)((byte)(uVar60 >> 1) & 1);
      auVar99._4_4_ = (uint)bVar58 * auVar97._4_4_ | (uint)!bVar58 * local_3e0._4_4_;
      bVar58 = (bool)((byte)(uVar60 >> 2) & 1);
      auVar99._8_4_ = (uint)bVar58 * auVar97._8_4_ | (uint)!bVar58 * local_3e0._8_4_;
      bVar58 = (bool)((byte)(uVar60 >> 3) & 1);
      auVar99._12_4_ = (uint)bVar58 * auVar97._12_4_ | (uint)!bVar58 * local_3e0._12_4_;
      bVar58 = (bool)((byte)(uVar60 >> 4) & 1);
      auVar99._16_4_ = (uint)bVar58 * auVar97._16_4_ | (uint)!bVar58 * local_3e0._16_4_;
      bVar58 = (bool)((byte)(uVar60 >> 5) & 1);
      auVar99._20_4_ = (uint)bVar58 * auVar97._20_4_ | (uint)!bVar58 * local_3e0._20_4_;
      bVar58 = (bool)((byte)(uVar60 >> 6) & 1);
      auVar99._24_4_ = (uint)bVar58 * auVar97._24_4_ | (uint)!bVar58 * local_3e0._24_4_;
      bVar58 = SUB81(uVar60 >> 7,0);
      auVar99._28_4_ = (uint)bVar58 * auVar97._28_4_ | (uint)!bVar58 * local_3e0._28_4_;
      auVar195._8_4_ = 0xff800000;
      auVar195._0_8_ = 0xff800000ff800000;
      auVar195._12_4_ = 0xff800000;
      auVar195._16_4_ = 0xff800000;
      auVar195._20_4_ = 0xff800000;
      auVar195._24_4_ = 0xff800000;
      auVar195._28_4_ = 0xff800000;
      auVar97 = vblendmps_avx512vl(auVar195,auVar96);
      auVar100._0_4_ =
           (uint)(bVar53 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar96._0_4_;
      bVar58 = (bool)((byte)(uVar60 >> 1) & 1);
      auVar100._4_4_ = (uint)bVar58 * auVar97._4_4_ | (uint)!bVar58 * auVar96._4_4_;
      bVar58 = (bool)((byte)(uVar60 >> 2) & 1);
      auVar100._8_4_ = (uint)bVar58 * auVar97._8_4_ | (uint)!bVar58 * auVar96._8_4_;
      bVar58 = (bool)((byte)(uVar60 >> 3) & 1);
      auVar100._12_4_ = (uint)bVar58 * auVar97._12_4_ | (uint)!bVar58 * auVar96._12_4_;
      bVar58 = (bool)((byte)(uVar60 >> 4) & 1);
      auVar100._16_4_ = (uint)bVar58 * auVar97._16_4_ | (uint)!bVar58 * auVar96._16_4_;
      bVar58 = (bool)((byte)(uVar60 >> 5) & 1);
      auVar100._20_4_ = (uint)bVar58 * auVar97._20_4_ | (uint)!bVar58 * auVar96._20_4_;
      bVar58 = (bool)((byte)(uVar60 >> 6) & 1);
      auVar100._24_4_ = (uint)bVar58 * auVar97._24_4_ | (uint)!bVar58 * auVar96._24_4_;
      bVar58 = SUB81(uVar60 >> 7,0);
      auVar100._28_4_ = (uint)bVar58 * auVar97._28_4_ | (uint)!bVar58 * auVar96._28_4_;
      auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar96,auVar93);
      auVar97 = vmaxps_avx512vl(local_360,auVar96);
      auVar24._8_4_ = 0x36000000;
      auVar24._0_8_ = 0x3600000036000000;
      auVar24._12_4_ = 0x36000000;
      auVar24._16_4_ = 0x36000000;
      auVar24._20_4_ = 0x36000000;
      auVar24._24_4_ = 0x36000000;
      auVar24._28_4_ = 0x36000000;
      auVar97 = vmulps_avx512vl(auVar97,auVar24);
      vandps_avx512vl(auVar77,auVar96);
      uVar54 = vcmpps_avx512vl(auVar97,auVar97,1);
      uVar60 = uVar60 & uVar54;
      bVar56 = (byte)uVar60;
      if (bVar56 != 0) {
        uVar54 = vcmpps_avx512vl(auVar75,_DAT_02020f00,2);
        auVar206._8_4_ = 0xff800000;
        auVar206._0_8_ = 0xff800000ff800000;
        auVar206._12_4_ = 0xff800000;
        auVar206._16_4_ = 0xff800000;
        auVar206._20_4_ = 0xff800000;
        auVar206._24_4_ = 0xff800000;
        auVar206._28_4_ = 0xff800000;
        auVar75 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar96 = vblendmps_avx512vl(auVar75,auVar206);
        bVar51 = (byte)uVar54;
        uVar61 = (uint)(bVar51 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar51 & 1) * auVar97._0_4_;
        bVar58 = (bool)((byte)(uVar54 >> 1) & 1);
        uVar118 = (uint)bVar58 * auVar96._4_4_ | (uint)!bVar58 * auVar97._4_4_;
        bVar58 = (bool)((byte)(uVar54 >> 2) & 1);
        uVar119 = (uint)bVar58 * auVar96._8_4_ | (uint)!bVar58 * auVar97._8_4_;
        bVar58 = (bool)((byte)(uVar54 >> 3) & 1);
        uVar120 = (uint)bVar58 * auVar96._12_4_ | (uint)!bVar58 * auVar97._12_4_;
        bVar58 = (bool)((byte)(uVar54 >> 4) & 1);
        uVar121 = (uint)bVar58 * auVar96._16_4_ | (uint)!bVar58 * auVar97._16_4_;
        bVar58 = (bool)((byte)(uVar54 >> 5) & 1);
        uVar122 = (uint)bVar58 * auVar96._20_4_ | (uint)!bVar58 * auVar97._20_4_;
        bVar58 = (bool)((byte)(uVar54 >> 6) & 1);
        uVar123 = (uint)bVar58 * auVar96._24_4_ | (uint)!bVar58 * auVar97._24_4_;
        bVar58 = SUB81(uVar54 >> 7,0);
        uVar124 = (uint)bVar58 * auVar96._28_4_ | (uint)!bVar58 * auVar97._28_4_;
        auVar99._0_4_ = (bVar56 & 1) * uVar61 | !(bool)(bVar56 & 1) * auVar99._0_4_;
        bVar58 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar99._4_4_ = bVar58 * uVar118 | !bVar58 * auVar99._4_4_;
        bVar58 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar99._8_4_ = bVar58 * uVar119 | !bVar58 * auVar99._8_4_;
        bVar58 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar99._12_4_ = bVar58 * uVar120 | !bVar58 * auVar99._12_4_;
        bVar58 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar99._16_4_ = bVar58 * uVar121 | !bVar58 * auVar99._16_4_;
        bVar58 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar99._20_4_ = bVar58 * uVar122 | !bVar58 * auVar99._20_4_;
        bVar58 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar99._24_4_ = bVar58 * uVar123 | !bVar58 * auVar99._24_4_;
        bVar58 = SUB81(uVar60 >> 7,0);
        auVar99._28_4_ = bVar58 * uVar124 | !bVar58 * auVar99._28_4_;
        auVar75 = vblendmps_avx512vl(auVar206,auVar75);
        bVar58 = (bool)((byte)(uVar54 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar54 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar54 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar54 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar54 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar54 >> 6) & 1);
        bVar11 = SUB81(uVar54 >> 7,0);
        auVar100._0_4_ =
             (uint)(bVar56 & 1) *
             ((uint)(bVar51 & 1) * auVar75._0_4_ | !(bool)(bVar51 & 1) * uVar61) |
             !(bool)(bVar56 & 1) * auVar100._0_4_;
        bVar5 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar100._4_4_ =
             (uint)bVar5 * ((uint)bVar58 * auVar75._4_4_ | !bVar58 * uVar118) |
             !bVar5 * auVar100._4_4_;
        bVar58 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar100._8_4_ =
             (uint)bVar58 * ((uint)bVar6 * auVar75._8_4_ | !bVar6 * uVar119) |
             !bVar58 * auVar100._8_4_;
        bVar58 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar100._12_4_ =
             (uint)bVar58 * ((uint)bVar7 * auVar75._12_4_ | !bVar7 * uVar120) |
             !bVar58 * auVar100._12_4_;
        bVar58 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar100._16_4_ =
             (uint)bVar58 * ((uint)bVar8 * auVar75._16_4_ | !bVar8 * uVar121) |
             !bVar58 * auVar100._16_4_;
        bVar58 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar100._20_4_ =
             (uint)bVar58 * ((uint)bVar9 * auVar75._20_4_ | !bVar9 * uVar122) |
             !bVar58 * auVar100._20_4_;
        bVar58 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar100._24_4_ =
             (uint)bVar58 * ((uint)bVar10 * auVar75._24_4_ | !bVar10 * uVar123) |
             !bVar58 * auVar100._24_4_;
        bVar58 = SUB81(uVar60 >> 7,0);
        auVar100._28_4_ =
             (uint)bVar58 * ((uint)bVar11 * auVar75._28_4_ | !bVar11 * uVar124) |
             !bVar58 * auVar100._28_4_;
        bVar53 = (~bVar56 | bVar51) & bVar53;
      }
    }
    if ((bVar53 & 0x7f) == 0) {
      auVar104._8_4_ = 0x3f800000;
      auVar104._0_8_ = &DAT_3f8000003f800000;
      auVar104._12_4_ = 0x3f800000;
      auVar104._16_4_ = 0x3f800000;
      auVar104._20_4_ = 0x3f800000;
      auVar104._24_4_ = 0x3f800000;
      auVar104._28_4_ = 0x3f800000;
LAB_01b505d9:
      auVar199 = ZEXT3264(_DAT_02020f20);
      auVar242 = ZEXT3264(auVar101);
      auVar235 = ZEXT3264(auVar83);
      auVar185 = ZEXT3264(auVar104);
      auVar255 = ZEXT3264(local_840);
      auVar252 = ZEXT3264(local_860);
      auVar250 = ZEXT3264(local_740);
      auVar251 = ZEXT3264(local_760);
      auVar253 = ZEXT3264(local_880);
      auVar256 = ZEXT3264(local_8a0);
      auVar254 = ZEXT3264(local_8c0);
      auVar257 = ZEXT3264(local_780);
      auVar259 = ZEXT3264(local_7a0);
      auVar258 = ZEXT3264(local_6e0);
      auVar249 = ZEXT3264(local_7c0);
    }
    else {
      fVar210 = *(float *)(ray + k * 4 + 0x80) - (float)local_600._0_4_;
      auVar196._4_4_ = fVar210;
      auVar196._0_4_ = fVar210;
      auVar196._8_4_ = fVar210;
      auVar196._12_4_ = fVar210;
      auVar196._16_4_ = fVar210;
      auVar196._20_4_ = fVar210;
      auVar196._24_4_ = fVar210;
      auVar196._28_4_ = fVar210;
      auVar96 = vminps_avx512vl(auVar196,auVar100);
      auVar49._4_4_ = fStack_25c;
      auVar49._0_4_ = local_260;
      auVar49._8_4_ = fStack_258;
      auVar49._12_4_ = fStack_254;
      auVar49._16_4_ = fStack_250;
      auVar49._20_4_ = fStack_24c;
      auVar49._24_4_ = fStack_248;
      auVar49._28_4_ = fStack_244;
      auVar75 = vmaxps_avx512vl(auVar49,auVar99);
      auVar88 = vmulps_avx512vl(auVar88,auVar103);
      auVar82 = vfmadd213ps_avx512vl(auVar82,auVar102,auVar88);
      auVar81 = vfmadd213ps_avx512vl(auVar81,auVar101,auVar82);
      auVar82 = vmulps_avx512vl(local_340,auVar103);
      auVar82 = vfmadd231ps_avx512vl(auVar82,local_460,auVar102);
      auVar82 = vfmadd231ps_avx512vl(auVar82,local_840,auVar101);
      auVar88 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar82,auVar88);
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar12 = vcmpps_avx512vl(auVar88,auVar101,1);
      auVar102 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar81 = vxorps_avx512vl(auVar81,auVar102);
      auVar103 = vrcp14ps_avx512vl(auVar82);
      auVar97 = vxorps_avx512vl(auVar82,auVar102);
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar98 = vfnmadd213ps_avx512vl(auVar103,auVar82,auVar104);
      auVar98 = vfmadd132ps_avx512vl(auVar98,auVar103,auVar103);
      auVar81 = vmulps_avx512vl(auVar98,auVar81);
      uVar13 = vcmpps_avx512vl(auVar82,auVar97,1);
      bVar56 = (byte)uVar12 | (byte)uVar13;
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar105 = vblendmps_avx512vl(auVar81,auVar98);
      auVar106._0_4_ =
           (uint)(bVar56 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar56 & 1) * auVar103._0_4_;
      bVar58 = (bool)(bVar56 >> 1 & 1);
      auVar106._4_4_ = (uint)bVar58 * auVar105._4_4_ | (uint)!bVar58 * auVar103._4_4_;
      bVar58 = (bool)(bVar56 >> 2 & 1);
      auVar106._8_4_ = (uint)bVar58 * auVar105._8_4_ | (uint)!bVar58 * auVar103._8_4_;
      bVar58 = (bool)(bVar56 >> 3 & 1);
      auVar106._12_4_ = (uint)bVar58 * auVar105._12_4_ | (uint)!bVar58 * auVar103._12_4_;
      bVar58 = (bool)(bVar56 >> 4 & 1);
      auVar106._16_4_ = (uint)bVar58 * auVar105._16_4_ | (uint)!bVar58 * auVar103._16_4_;
      bVar58 = (bool)(bVar56 >> 5 & 1);
      auVar106._20_4_ = (uint)bVar58 * auVar105._20_4_ | (uint)!bVar58 * auVar103._20_4_;
      bVar58 = (bool)(bVar56 >> 6 & 1);
      auVar106._24_4_ = (uint)bVar58 * auVar105._24_4_ | (uint)!bVar58 * auVar103._24_4_;
      auVar106._28_4_ =
           (uint)(bVar56 >> 7) * auVar105._28_4_ | (uint)!(bool)(bVar56 >> 7) * auVar103._28_4_;
      auVar75 = vmaxps_avx(auVar75,auVar106);
      uVar13 = vcmpps_avx512vl(auVar82,auVar97,6);
      bVar56 = (byte)uVar12 | (byte)uVar13;
      auVar107._0_4_ = (uint)(bVar56 & 1) * 0x7f800000 | (uint)!(bool)(bVar56 & 1) * auVar81._0_4_;
      bVar58 = (bool)(bVar56 >> 1 & 1);
      auVar107._4_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * auVar81._4_4_;
      bVar58 = (bool)(bVar56 >> 2 & 1);
      auVar107._8_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * auVar81._8_4_;
      bVar58 = (bool)(bVar56 >> 3 & 1);
      auVar107._12_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * auVar81._12_4_;
      bVar58 = (bool)(bVar56 >> 4 & 1);
      auVar107._16_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * auVar81._16_4_;
      bVar58 = (bool)(bVar56 >> 5 & 1);
      auVar107._20_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * auVar81._20_4_;
      bVar58 = (bool)(bVar56 >> 6 & 1);
      auVar107._24_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * auVar81._24_4_;
      auVar107._28_4_ =
           (uint)(bVar56 >> 7) * 0x7f800000 | (uint)!(bool)(bVar56 >> 7) * auVar81._28_4_;
      auVar81 = vminps_avx(auVar96,auVar107);
      auVar69 = vxorps_avx512vl(auVar97._0_16_,auVar97._0_16_);
      auVar78 = vsubps_avx512vl(ZEXT1632(auVar69),auVar78);
      auVar82 = vsubps_avx512vl(ZEXT1632(auVar69),auVar83);
      auVar103 = ZEXT1632(auVar69);
      auVar84 = vsubps_avx512vl(auVar103,auVar84);
      auVar33._4_4_ = auVar84._4_4_ * auVar87._4_4_;
      auVar33._0_4_ = auVar84._0_4_ * auVar87._0_4_;
      auVar33._8_4_ = auVar84._8_4_ * auVar87._8_4_;
      auVar33._12_4_ = auVar84._12_4_ * auVar87._12_4_;
      auVar33._16_4_ = auVar84._16_4_ * auVar87._16_4_;
      auVar33._20_4_ = auVar84._20_4_ * auVar87._20_4_;
      auVar33._24_4_ = auVar84._24_4_ * auVar87._24_4_;
      auVar33._28_4_ = auVar84._28_4_;
      auVar82 = vfnmsub231ps_avx512vl(auVar33,auVar86,auVar82);
      auVar78 = vfnmadd231ps_avx512vl(auVar82,auVar85,auVar78);
      auVar82 = vmulps_avx512vl(local_340,auVar87);
      auVar82 = vfnmsub231ps_avx512vl(auVar82,local_460,auVar86);
      auVar82 = vfnmadd231ps_avx512vl(auVar82,local_840,auVar85);
      vandps_avx512vl(auVar82,auVar88);
      uVar12 = vcmpps_avx512vl(auVar82,auVar101,1);
      auVar78 = vxorps_avx512vl(auVar78,auVar102);
      auVar88 = vrcp14ps_avx512vl(auVar82);
      auVar101 = vxorps_avx512vl(auVar82,auVar102);
      auVar84 = vfnmadd213ps_avx512vl(auVar88,auVar82,auVar104);
      auVar69 = vfmadd132ps_fma(auVar84,auVar88,auVar88);
      fVar210 = auVar69._0_4_ * auVar78._0_4_;
      fVar216 = auVar69._4_4_ * auVar78._4_4_;
      auVar34._4_4_ = fVar216;
      auVar34._0_4_ = fVar210;
      fVar217 = auVar69._8_4_ * auVar78._8_4_;
      auVar34._8_4_ = fVar217;
      fVar218 = auVar69._12_4_ * auVar78._12_4_;
      auVar34._12_4_ = fVar218;
      fVar219 = auVar78._16_4_ * 0.0;
      auVar34._16_4_ = fVar219;
      fVar220 = auVar78._20_4_ * 0.0;
      auVar34._20_4_ = fVar220;
      fVar239 = auVar78._24_4_ * 0.0;
      auVar34._24_4_ = fVar239;
      auVar34._28_4_ = auVar78._28_4_;
      uVar13 = vcmpps_avx512vl(auVar82,auVar101,1);
      bVar56 = (byte)uVar12 | (byte)uVar13;
      auVar84 = vblendmps_avx512vl(auVar34,auVar98);
      auVar108._0_4_ =
           (uint)(bVar56 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar56 & 1) * auVar88._0_4_;
      bVar58 = (bool)(bVar56 >> 1 & 1);
      auVar108._4_4_ = (uint)bVar58 * auVar84._4_4_ | (uint)!bVar58 * auVar88._4_4_;
      bVar58 = (bool)(bVar56 >> 2 & 1);
      auVar108._8_4_ = (uint)bVar58 * auVar84._8_4_ | (uint)!bVar58 * auVar88._8_4_;
      bVar58 = (bool)(bVar56 >> 3 & 1);
      auVar108._12_4_ = (uint)bVar58 * auVar84._12_4_ | (uint)!bVar58 * auVar88._12_4_;
      bVar58 = (bool)(bVar56 >> 4 & 1);
      auVar108._16_4_ = (uint)bVar58 * auVar84._16_4_ | (uint)!bVar58 * auVar88._16_4_;
      bVar58 = (bool)(bVar56 >> 5 & 1);
      auVar108._20_4_ = (uint)bVar58 * auVar84._20_4_ | (uint)!bVar58 * auVar88._20_4_;
      bVar58 = (bool)(bVar56 >> 6 & 1);
      auVar108._24_4_ = (uint)bVar58 * auVar84._24_4_ | (uint)!bVar58 * auVar88._24_4_;
      auVar108._28_4_ =
           (uint)(bVar56 >> 7) * auVar84._28_4_ | (uint)!(bool)(bVar56 >> 7) * auVar88._28_4_;
      _local_5a0 = vmaxps_avx(auVar75,auVar108);
      uVar13 = vcmpps_avx512vl(auVar82,auVar101,6);
      bVar56 = (byte)uVar12 | (byte)uVar13;
      auVar83._0_4_ = (uint)(bVar56 & 1) * 0x7f800000 | (uint)!(bool)(bVar56 & 1) * (int)fVar210;
      bVar58 = (bool)(bVar56 >> 1 & 1);
      auVar83._4_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar216;
      bVar58 = (bool)(bVar56 >> 2 & 1);
      auVar83._8_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar217;
      bVar58 = (bool)(bVar56 >> 3 & 1);
      auVar83._12_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar218;
      bVar58 = (bool)(bVar56 >> 4 & 1);
      auVar83._16_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar219;
      bVar58 = (bool)(bVar56 >> 5 & 1);
      auVar83._20_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar220;
      bVar58 = (bool)(bVar56 >> 6 & 1);
      auVar83._24_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar239;
      auVar83._28_4_ =
           (uint)(bVar56 >> 7) * 0x7f800000 | (uint)!(bool)(bVar56 >> 7) * auVar78._28_4_;
      local_300 = vminps_avx(auVar81,auVar83);
      auVar231 = ZEXT3264(local_300);
      uVar12 = vcmpps_avx512vl(_local_5a0,local_300,2);
      bVar53 = bVar53 & 0x7f & (byte)uVar12;
      if (bVar53 == 0) goto LAB_01b505d9;
      auVar79 = vmaxps_avx512vl(auVar103,auVar79);
      auVar75 = vminps_avx512vl(local_3c0,auVar104);
      auVar40 = ZEXT412(0);
      auVar78 = ZEXT1232(auVar40) << 0x20;
      auVar75 = vmaxps_avx(auVar75,ZEXT1232(auVar40) << 0x20);
      auVar81 = vminps_avx512vl(local_3e0,auVar104);
      auVar35._4_4_ = (auVar75._4_4_ + 1.0) * 0.125;
      auVar35._0_4_ = (auVar75._0_4_ + 0.0) * 0.125;
      auVar35._8_4_ = (auVar75._8_4_ + 2.0) * 0.125;
      auVar35._12_4_ = (auVar75._12_4_ + 3.0) * 0.125;
      auVar35._16_4_ = (auVar75._16_4_ + 4.0) * 0.125;
      auVar35._20_4_ = (auVar75._20_4_ + 5.0) * 0.125;
      auVar35._24_4_ = (auVar75._24_4_ + 6.0) * 0.125;
      auVar35._28_4_ = auVar75._28_4_ + 7.0;
      auVar69 = vfmadd213ps_fma(auVar35,auVar137,local_820);
      local_3c0 = ZEXT1632(auVar69);
      auVar75 = vmaxps_avx(auVar81,ZEXT1232(auVar40) << 0x20);
      auVar36._4_4_ = (auVar75._4_4_ + 1.0) * 0.125;
      auVar36._0_4_ = (auVar75._0_4_ + 0.0) * 0.125;
      auVar36._8_4_ = (auVar75._8_4_ + 2.0) * 0.125;
      auVar36._12_4_ = (auVar75._12_4_ + 3.0) * 0.125;
      auVar36._16_4_ = (auVar75._16_4_ + 4.0) * 0.125;
      auVar36._20_4_ = (auVar75._20_4_ + 5.0) * 0.125;
      auVar36._24_4_ = (auVar75._24_4_ + 6.0) * 0.125;
      auVar36._28_4_ = auVar75._28_4_ + 7.0;
      auVar69 = vfmadd213ps_fma(auVar36,auVar137,local_820);
      local_3e0 = ZEXT1632(auVar69);
      auVar197._0_4_ = auVar79._0_4_ * auVar79._0_4_;
      auVar197._4_4_ = auVar79._4_4_ * auVar79._4_4_;
      auVar197._8_4_ = auVar79._8_4_ * auVar79._8_4_;
      auVar197._12_4_ = auVar79._12_4_ * auVar79._12_4_;
      auVar197._16_4_ = auVar79._16_4_ * auVar79._16_4_;
      auVar197._20_4_ = auVar79._20_4_ * auVar79._20_4_;
      auVar197._24_4_ = auVar79._24_4_ * auVar79._24_4_;
      auVar197._28_4_ = 0;
      auVar75 = vsubps_avx(auVar90,auVar197);
      auVar242 = ZEXT3264(auVar75);
      auVar79 = vmulps_avx512vl(auVar89,auVar75);
      auVar79 = vsubps_avx512vl(auVar95,auVar79);
      uVar12 = vcmpps_avx512vl(auVar79,ZEXT1232(auVar40) << 0x20,5);
      bVar56 = (byte)uVar12;
      auVar257 = ZEXT3264(local_780);
      auVar259 = ZEXT3264(local_7a0);
      auVar249 = ZEXT3264(local_7c0);
      if (bVar56 == 0) {
        auVar76 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar74 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar79 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar81 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar235 = ZEXT864(0) << 0x20;
        auVar109._8_4_ = 0x7f800000;
        auVar109._0_8_ = 0x7f8000007f800000;
        auVar109._12_4_ = 0x7f800000;
        auVar109._16_4_ = 0x7f800000;
        auVar109._20_4_ = 0x7f800000;
        auVar109._24_4_ = 0x7f800000;
        auVar109._28_4_ = 0x7f800000;
        auVar110._8_4_ = 0xff800000;
        auVar110._0_8_ = 0xff800000ff800000;
        auVar110._12_4_ = 0xff800000;
        auVar110._16_4_ = 0xff800000;
        auVar110._20_4_ = 0xff800000;
        auVar110._24_4_ = 0xff800000;
        auVar110._28_4_ = 0xff800000;
      }
      else {
        auVar67 = vxorps_avx512vl(auVar86._0_16_,auVar86._0_16_);
        uVar60 = vcmpps_avx512vl(auVar79,auVar103,5);
        auVar78 = vsqrtps_avx(auVar79);
        auVar207._0_4_ = auVar77._0_4_ + auVar77._0_4_;
        auVar207._4_4_ = auVar77._4_4_ + auVar77._4_4_;
        auVar207._8_4_ = auVar77._8_4_ + auVar77._8_4_;
        auVar207._12_4_ = auVar77._12_4_ + auVar77._12_4_;
        auVar207._16_4_ = auVar77._16_4_ + auVar77._16_4_;
        auVar207._20_4_ = auVar77._20_4_ + auVar77._20_4_;
        auVar207._24_4_ = auVar77._24_4_ + auVar77._24_4_;
        auVar207._28_4_ = auVar77._28_4_ + auVar77._28_4_;
        auVar79 = vrcp14ps_avx512vl(auVar207);
        auVar81 = vfnmadd213ps_avx512vl(auVar207,auVar79,auVar104);
        auVar69 = vfmadd132ps_fma(auVar81,auVar79,auVar79);
        auVar25._8_4_ = 0x80000000;
        auVar25._0_8_ = 0x8000000080000000;
        auVar25._12_4_ = 0x80000000;
        auVar25._16_4_ = 0x80000000;
        auVar25._20_4_ = 0x80000000;
        auVar25._24_4_ = 0x80000000;
        auVar25._28_4_ = 0x80000000;
        auVar79 = vxorps_avx512vl(auVar94,auVar25);
        auVar79 = vsubps_avx(auVar79,auVar78);
        auVar37._4_4_ = auVar79._4_4_ * auVar69._4_4_;
        auVar37._0_4_ = auVar79._0_4_ * auVar69._0_4_;
        auVar37._8_4_ = auVar79._8_4_ * auVar69._8_4_;
        auVar37._12_4_ = auVar79._12_4_ * auVar69._12_4_;
        auVar37._16_4_ = auVar79._16_4_ * 0.0;
        auVar37._20_4_ = auVar79._20_4_ * 0.0;
        auVar37._24_4_ = auVar79._24_4_ * 0.0;
        auVar37._28_4_ = 0x3e000000;
        auVar78 = vsubps_avx512vl(auVar78,auVar94);
        auVar38._4_4_ = auVar78._4_4_ * auVar69._4_4_;
        auVar38._0_4_ = auVar78._0_4_ * auVar69._0_4_;
        auVar38._8_4_ = auVar78._8_4_ * auVar69._8_4_;
        auVar38._12_4_ = auVar78._12_4_ * auVar69._12_4_;
        auVar38._16_4_ = auVar78._16_4_ * 0.0;
        auVar38._20_4_ = auVar78._20_4_ * 0.0;
        auVar38._24_4_ = auVar78._24_4_ * 0.0;
        auVar38._28_4_ = 0x7f800000;
        auVar69 = vfmadd213ps_fma(auVar91,auVar37,auVar92);
        auVar39._4_4_ = auVar80._4_4_ * auVar69._4_4_;
        auVar39._0_4_ = auVar80._0_4_ * auVar69._0_4_;
        auVar39._8_4_ = auVar80._8_4_ * auVar69._8_4_;
        auVar39._12_4_ = auVar80._12_4_ * auVar69._12_4_;
        auVar39._16_4_ = auVar80._16_4_ * 0.0;
        auVar39._20_4_ = auVar80._20_4_ * 0.0;
        auVar39._24_4_ = auVar80._24_4_ * 0.0;
        auVar39._28_4_ = auVar79._28_4_;
        auVar78 = vmulps_avx512vl(local_840,auVar37);
        auVar81 = vmulps_avx512vl(local_460,auVar37);
        auVar82 = vmulps_avx512vl(local_340,auVar37);
        auVar79 = vfmadd213ps_avx512vl(auVar74,auVar39,local_800);
        auVar79 = vsubps_avx512vl(auVar78,auVar79);
        auVar78 = vfmadd213ps_avx512vl(auVar76,auVar39,local_560);
        auVar81 = vsubps_avx512vl(auVar81,auVar78);
        auVar69 = vfmadd213ps_fma(auVar39,local_580,local_7e0);
        auVar78 = vsubps_avx(auVar82,ZEXT1632(auVar69));
        auVar235 = ZEXT3264(auVar78);
        auVar78 = vfmadd213ps_avx512vl(auVar91,auVar38,auVar92);
        auVar80 = vmulps_avx512vl(auVar80,auVar78);
        auVar78 = vmulps_avx512vl(local_840,auVar38);
        auVar82 = vmulps_avx512vl(local_460,auVar38);
        auVar88 = vmulps_avx512vl(local_340,auVar38);
        auVar74 = vfmadd213ps_avx512vl(auVar74,auVar80,local_800);
        auVar78 = vsubps_avx(auVar78,auVar74);
        auVar69 = vfmadd213ps_fma(auVar76,auVar80,local_560);
        auVar76 = vsubps_avx512vl(auVar82,ZEXT1632(auVar69));
        auVar69 = vfmadd213ps_fma(local_580,auVar80,local_7e0);
        auVar74 = vsubps_avx(auVar88,ZEXT1632(auVar69));
        auVar138._8_4_ = 0x7f800000;
        auVar138._0_8_ = 0x7f8000007f800000;
        auVar138._12_4_ = 0x7f800000;
        auVar138._16_4_ = 0x7f800000;
        auVar138._20_4_ = 0x7f800000;
        auVar138._24_4_ = 0x7f800000;
        auVar138._28_4_ = 0x7f800000;
        auVar80 = vblendmps_avx512vl(auVar138,auVar37);
        bVar58 = (bool)((byte)uVar60 & 1);
        auVar109._0_4_ = (uint)bVar58 * auVar80._0_4_ | (uint)!bVar58 * auVar88._0_4_;
        bVar58 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar109._4_4_ = (uint)bVar58 * auVar80._4_4_ | (uint)!bVar58 * auVar88._4_4_;
        bVar58 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar109._8_4_ = (uint)bVar58 * auVar80._8_4_ | (uint)!bVar58 * auVar88._8_4_;
        bVar58 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar109._12_4_ = (uint)bVar58 * auVar80._12_4_ | (uint)!bVar58 * auVar88._12_4_;
        bVar58 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar109._16_4_ = (uint)bVar58 * auVar80._16_4_ | (uint)!bVar58 * auVar88._16_4_;
        bVar58 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar109._20_4_ = (uint)bVar58 * auVar80._20_4_ | (uint)!bVar58 * auVar88._20_4_;
        bVar58 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar109._24_4_ = (uint)bVar58 * auVar80._24_4_ | (uint)!bVar58 * auVar88._24_4_;
        bVar58 = SUB81(uVar60 >> 7,0);
        auVar109._28_4_ = (uint)bVar58 * auVar80._28_4_ | (uint)!bVar58 * auVar88._28_4_;
        auVar139._8_4_ = 0xff800000;
        auVar139._0_8_ = 0xff800000ff800000;
        auVar139._12_4_ = 0xff800000;
        auVar139._16_4_ = 0xff800000;
        auVar139._20_4_ = 0xff800000;
        auVar139._24_4_ = 0xff800000;
        auVar139._28_4_ = 0xff800000;
        auVar80 = vblendmps_avx512vl(auVar139,auVar38);
        bVar58 = (bool)((byte)uVar60 & 1);
        auVar110._0_4_ = (uint)bVar58 * auVar80._0_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar110._4_4_ = (uint)bVar58 * auVar80._4_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar110._8_4_ = (uint)bVar58 * auVar80._8_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar110._12_4_ = (uint)bVar58 * auVar80._12_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar110._16_4_ = (uint)bVar58 * auVar80._16_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar110._20_4_ = (uint)bVar58 * auVar80._20_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar110._24_4_ = (uint)bVar58 * auVar80._24_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = SUB81(uVar60 >> 7,0);
        auVar110._28_4_ = (uint)bVar58 * auVar80._28_4_ | (uint)!bVar58 * -0x800000;
        auVar225._8_4_ = 0x7fffffff;
        auVar225._0_8_ = 0x7fffffff7fffffff;
        auVar225._12_4_ = 0x7fffffff;
        auVar225._16_4_ = 0x7fffffff;
        auVar225._20_4_ = 0x7fffffff;
        auVar225._24_4_ = 0x7fffffff;
        auVar225._28_4_ = 0x7fffffff;
        auVar80 = vandps_avx(auVar225,auVar93);
        auVar80 = vmaxps_avx(local_360,auVar80);
        auVar26._8_4_ = 0x36000000;
        auVar26._0_8_ = 0x3600000036000000;
        auVar26._12_4_ = 0x36000000;
        auVar26._16_4_ = 0x36000000;
        auVar26._20_4_ = 0x36000000;
        auVar26._24_4_ = 0x36000000;
        auVar26._28_4_ = 0x36000000;
        auVar80 = vmulps_avx512vl(auVar80,auVar26);
        auVar77 = vandps_avx(auVar77,auVar225);
        uVar54 = vcmpps_avx512vl(auVar77,auVar80,1);
        uVar60 = uVar60 & uVar54;
        bVar51 = (byte)uVar60;
        if (bVar51 != 0) {
          uVar54 = vcmpps_avx512vl(auVar75,ZEXT1632(auVar67),2);
          auVar226._8_4_ = 0xff800000;
          auVar226._0_8_ = 0xff800000ff800000;
          auVar226._12_4_ = 0xff800000;
          auVar226._16_4_ = 0xff800000;
          auVar226._20_4_ = 0xff800000;
          auVar226._24_4_ = 0xff800000;
          auVar226._28_4_ = 0xff800000;
          auVar241._8_4_ = 0x7f800000;
          auVar241._0_8_ = 0x7f8000007f800000;
          auVar241._12_4_ = 0x7f800000;
          auVar241._16_4_ = 0x7f800000;
          auVar241._20_4_ = 0x7f800000;
          auVar241._24_4_ = 0x7f800000;
          auVar241._28_4_ = 0x7f800000;
          auVar242 = ZEXT3264(auVar241);
          auVar77 = vblendmps_avx512vl(auVar241,auVar226);
          bVar50 = (byte)uVar54;
          uVar61 = (uint)(bVar50 & 1) * auVar77._0_4_ | (uint)!(bool)(bVar50 & 1) * auVar80._0_4_;
          bVar58 = (bool)((byte)(uVar54 >> 1) & 1);
          uVar118 = (uint)bVar58 * auVar77._4_4_ | (uint)!bVar58 * auVar80._4_4_;
          bVar58 = (bool)((byte)(uVar54 >> 2) & 1);
          uVar119 = (uint)bVar58 * auVar77._8_4_ | (uint)!bVar58 * auVar80._8_4_;
          bVar58 = (bool)((byte)(uVar54 >> 3) & 1);
          uVar120 = (uint)bVar58 * auVar77._12_4_ | (uint)!bVar58 * auVar80._12_4_;
          bVar58 = (bool)((byte)(uVar54 >> 4) & 1);
          uVar121 = (uint)bVar58 * auVar77._16_4_ | (uint)!bVar58 * auVar80._16_4_;
          bVar58 = (bool)((byte)(uVar54 >> 5) & 1);
          uVar122 = (uint)bVar58 * auVar77._20_4_ | (uint)!bVar58 * auVar80._20_4_;
          bVar58 = (bool)((byte)(uVar54 >> 6) & 1);
          uVar123 = (uint)bVar58 * auVar77._24_4_ | (uint)!bVar58 * auVar80._24_4_;
          bVar58 = SUB81(uVar54 >> 7,0);
          uVar124 = (uint)bVar58 * auVar77._28_4_ | (uint)!bVar58 * auVar80._28_4_;
          auVar109._0_4_ = (bVar51 & 1) * uVar61 | !(bool)(bVar51 & 1) * auVar109._0_4_;
          bVar58 = (bool)((byte)(uVar60 >> 1) & 1);
          auVar109._4_4_ = bVar58 * uVar118 | !bVar58 * auVar109._4_4_;
          bVar58 = (bool)((byte)(uVar60 >> 2) & 1);
          auVar109._8_4_ = bVar58 * uVar119 | !bVar58 * auVar109._8_4_;
          bVar58 = (bool)((byte)(uVar60 >> 3) & 1);
          auVar109._12_4_ = bVar58 * uVar120 | !bVar58 * auVar109._12_4_;
          bVar58 = (bool)((byte)(uVar60 >> 4) & 1);
          auVar109._16_4_ = bVar58 * uVar121 | !bVar58 * auVar109._16_4_;
          bVar58 = (bool)((byte)(uVar60 >> 5) & 1);
          auVar109._20_4_ = bVar58 * uVar122 | !bVar58 * auVar109._20_4_;
          bVar58 = (bool)((byte)(uVar60 >> 6) & 1);
          auVar109._24_4_ = bVar58 * uVar123 | !bVar58 * auVar109._24_4_;
          bVar58 = SUB81(uVar60 >> 7,0);
          auVar109._28_4_ = bVar58 * uVar124 | !bVar58 * auVar109._28_4_;
          auVar77 = vblendmps_avx512vl(auVar226,auVar241);
          bVar58 = (bool)((byte)(uVar54 >> 1) & 1);
          bVar6 = (bool)((byte)(uVar54 >> 2) & 1);
          bVar7 = (bool)((byte)(uVar54 >> 3) & 1);
          bVar8 = (bool)((byte)(uVar54 >> 4) & 1);
          bVar9 = (bool)((byte)(uVar54 >> 5) & 1);
          bVar10 = (bool)((byte)(uVar54 >> 6) & 1);
          bVar11 = SUB81(uVar54 >> 7,0);
          auVar110._0_4_ =
               (uint)(bVar51 & 1) *
               ((uint)(bVar50 & 1) * auVar77._0_4_ | !(bool)(bVar50 & 1) * uVar61) |
               !(bool)(bVar51 & 1) * auVar110._0_4_;
          bVar5 = (bool)((byte)(uVar60 >> 1) & 1);
          auVar110._4_4_ =
               (uint)bVar5 * ((uint)bVar58 * auVar77._4_4_ | !bVar58 * uVar118) |
               !bVar5 * auVar110._4_4_;
          bVar58 = (bool)((byte)(uVar60 >> 2) & 1);
          auVar110._8_4_ =
               (uint)bVar58 * ((uint)bVar6 * auVar77._8_4_ | !bVar6 * uVar119) |
               !bVar58 * auVar110._8_4_;
          bVar58 = (bool)((byte)(uVar60 >> 3) & 1);
          auVar110._12_4_ =
               (uint)bVar58 * ((uint)bVar7 * auVar77._12_4_ | !bVar7 * uVar120) |
               !bVar58 * auVar110._12_4_;
          bVar58 = (bool)((byte)(uVar60 >> 4) & 1);
          auVar110._16_4_ =
               (uint)bVar58 * ((uint)bVar8 * auVar77._16_4_ | !bVar8 * uVar121) |
               !bVar58 * auVar110._16_4_;
          bVar58 = (bool)((byte)(uVar60 >> 5) & 1);
          auVar110._20_4_ =
               (uint)bVar58 * ((uint)bVar9 * auVar77._20_4_ | !bVar9 * uVar122) |
               !bVar58 * auVar110._20_4_;
          bVar58 = (bool)((byte)(uVar60 >> 6) & 1);
          auVar110._24_4_ =
               (uint)bVar58 * ((uint)bVar10 * auVar77._24_4_ | !bVar10 * uVar123) |
               !bVar58 * auVar110._24_4_;
          bVar58 = SUB81(uVar60 >> 7,0);
          auVar110._28_4_ =
               (uint)bVar58 * ((uint)bVar11 * auVar77._28_4_ | !bVar11 * uVar124) |
               !bVar58 * auVar110._28_4_;
          bVar56 = (~bVar51 | bVar50) & bVar56;
        }
      }
      auVar255 = ZEXT3264(local_840);
      auVar252 = ZEXT3264(local_860);
      auVar253 = ZEXT3264(local_880);
      auVar256 = ZEXT3264(local_8a0);
      auVar254 = ZEXT3264(local_8c0);
      auVar258 = ZEXT3264(local_6e0);
      auVar77 = vmulps_avx512vl(local_340,auVar74);
      auVar77 = vfmadd231ps_avx512vl(auVar77,local_460,auVar76);
      auVar77 = vfmadd231ps_avx512vl(auVar77,local_840,auVar78);
      _local_1c0 = _local_5a0;
      local_1a0 = vminps_avx(local_300,auVar109);
      auVar215._8_4_ = 0x7fffffff;
      auVar215._0_8_ = 0x7fffffff7fffffff;
      auVar215._12_4_ = 0x7fffffff;
      auVar215._16_4_ = 0x7fffffff;
      auVar215._20_4_ = 0x7fffffff;
      auVar215._24_4_ = 0x7fffffff;
      auVar215._28_4_ = 0x7fffffff;
      auVar77 = vandps_avx(auVar77,auVar215);
      _local_320 = vmaxps_avx(_local_5a0,auVar110);
      auVar140._8_4_ = 0x3e99999a;
      auVar140._0_8_ = 0x3e99999a3e99999a;
      auVar140._12_4_ = 0x3e99999a;
      auVar140._16_4_ = 0x3e99999a;
      auVar140._20_4_ = 0x3e99999a;
      auVar140._24_4_ = 0x3e99999a;
      auVar140._28_4_ = 0x3e99999a;
      uVar12 = vcmpps_avx512vl(auVar77,auVar140,1);
      local_8cc = (undefined4)uVar12;
      uVar12 = vcmpps_avx512vl(_local_5a0,local_1a0,2);
      bVar51 = (byte)uVar12 & bVar53;
      _local_420 = _local_320;
      uVar13 = vcmpps_avx512vl(_local_320,local_300,2);
      auVar250 = ZEXT3264(local_740);
      auVar251 = ZEXT3264(local_760);
      if ((bVar53 & ((byte)uVar13 | (byte)uVar12)) != 0) {
        auVar77 = vmulps_avx512vl(local_340,auVar235._0_32_);
        auVar77 = vfmadd213ps_avx512vl(auVar81,local_460,auVar77);
        auVar77 = vfmadd213ps_avx512vl(auVar79,local_840,auVar77);
        auVar77 = vandps_avx(auVar77,auVar215);
        uVar12 = vcmpps_avx512vl(auVar77,auVar140,1);
        local_8d4 = (uint)(byte)~bVar56;
        bVar56 = (byte)uVar12 | ~bVar56;
        auVar141._8_4_ = 2;
        auVar141._0_8_ = 0x200000002;
        auVar141._12_4_ = 2;
        auVar141._16_4_ = 2;
        auVar141._20_4_ = 2;
        auVar141._24_4_ = 2;
        auVar141._28_4_ = 2;
        auVar27._8_4_ = 3;
        auVar27._0_8_ = 0x300000003;
        auVar27._12_4_ = 3;
        auVar27._16_4_ = 3;
        auVar27._20_4_ = 3;
        auVar27._24_4_ = 3;
        auVar27._28_4_ = 3;
        auVar77 = vpblendmd_avx512vl(auVar141,auVar27);
        local_2e0._0_4_ = (uint)(bVar56 & 1) * auVar77._0_4_ | (uint)!(bool)(bVar56 & 1) * 2;
        bVar58 = (bool)(bVar56 >> 1 & 1);
        local_2e0._4_4_ = (uint)bVar58 * auVar77._4_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar56 >> 2 & 1);
        local_2e0._8_4_ = (uint)bVar58 * auVar77._8_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar56 >> 3 & 1);
        local_2e0._12_4_ = (uint)bVar58 * auVar77._12_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar56 >> 4 & 1);
        local_2e0._16_4_ = (uint)bVar58 * auVar77._16_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar56 >> 5 & 1);
        local_2e0._20_4_ = (uint)bVar58 * auVar77._20_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar56 >> 6 & 1);
        local_2e0._24_4_ = (uint)bVar58 * auVar77._24_4_ | (uint)!bVar58 * 2;
        local_2e0._28_4_ = (uint)(bVar56 >> 7) * auVar77._28_4_ | (uint)!(bool)(bVar56 >> 7) * 2;
        local_380 = vpbroadcastd_avx512vl();
        uVar12 = vpcmpd_avx512vl(local_380,local_2e0,5);
        local_8d0 = (uint)bVar51;
        bVar51 = (byte)uVar12 & bVar51;
        if (bVar51 == 0) {
          auVar231 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
        }
        else {
          auVar67 = vminps_avx(local_640._0_16_,local_680._0_16_);
          auVar69 = vmaxps_avx(local_640._0_16_,local_680._0_16_);
          auVar62 = vminps_avx(local_660._0_16_,local_6a0._0_16_);
          auVar68 = vminps_avx(auVar67,auVar62);
          auVar67 = vmaxps_avx(local_660._0_16_,local_6a0._0_16_);
          auVar62 = vmaxps_avx(auVar69,auVar67);
          auVar170._8_4_ = 0x7fffffff;
          auVar170._0_8_ = 0x7fffffff7fffffff;
          auVar170._12_4_ = 0x7fffffff;
          auVar69 = vandps_avx(auVar68,auVar170);
          auVar67 = vandps_avx(auVar62,auVar170);
          auVar69 = vmaxps_avx(auVar69,auVar67);
          auVar67 = vmovshdup_avx(auVar69);
          auVar67 = vmaxss_avx(auVar67,auVar69);
          auVar69 = vshufpd_avx(auVar69,auVar69,1);
          auVar69 = vmaxss_avx(auVar69,auVar67);
          fVar210 = auVar69._0_4_ * 1.9073486e-06;
          local_610 = vshufps_avx(auVar62,auVar62,0xff);
          local_400 = (float)local_5a0._0_4_ + (float)local_440._0_4_;
          fStack_3fc = (float)local_5a0._4_4_ + (float)local_440._4_4_;
          fStack_3f8 = fStack_598 + fStack_438;
          fStack_3f4 = fStack_594 + fStack_434;
          fStack_3f0 = fStack_590 + fStack_430;
          fStack_3ec = fStack_58c + fStack_42c;
          fStack_3e8 = fStack_588 + fStack_428;
          fStack_3e4 = fStack_584 + fStack_424;
          do {
            auVar74 = local_820;
            auVar142._8_4_ = 0x7f800000;
            auVar142._0_8_ = 0x7f8000007f800000;
            auVar142._12_4_ = 0x7f800000;
            auVar142._16_4_ = 0x7f800000;
            auVar142._20_4_ = 0x7f800000;
            auVar142._24_4_ = 0x7f800000;
            auVar142._28_4_ = 0x7f800000;
            auVar77 = vblendmps_avx512vl(auVar142,_local_5a0);
            auVar111._0_4_ =
                 (uint)(bVar51 & 1) * auVar77._0_4_ | (uint)!(bool)(bVar51 & 1) * 0x7f800000;
            bVar58 = (bool)(bVar51 >> 1 & 1);
            auVar111._4_4_ = (uint)bVar58 * auVar77._4_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar51 >> 2 & 1);
            auVar111._8_4_ = (uint)bVar58 * auVar77._8_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar51 >> 3 & 1);
            auVar111._12_4_ = (uint)bVar58 * auVar77._12_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar51 >> 4 & 1);
            auVar111._16_4_ = (uint)bVar58 * auVar77._16_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar51 >> 5 & 1);
            auVar111._20_4_ = (uint)bVar58 * auVar77._20_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar51 >> 6 & 1);
            auVar111._24_4_ = (uint)bVar58 * auVar77._24_4_ | (uint)!bVar58 * 0x7f800000;
            auVar111._28_4_ =
                 (uint)(bVar51 >> 7) * auVar77._28_4_ | (uint)!(bool)(bVar51 >> 7) * 0x7f800000;
            auVar77 = vshufps_avx(auVar111,auVar111,0xb1);
            auVar77 = vminps_avx(auVar111,auVar77);
            auVar75 = vshufpd_avx(auVar77,auVar77,5);
            auVar77 = vminps_avx(auVar77,auVar75);
            auVar75 = vpermpd_avx2(auVar77,0x4e);
            auVar77 = vminps_avx(auVar77,auVar75);
            uVar12 = vcmpps_avx512vl(auVar111,auVar77,0);
            bVar50 = (byte)uVar12 & bVar51;
            bVar56 = bVar51;
            if (bVar50 != 0) {
              bVar56 = bVar50;
            }
            iVar15 = 0;
            for (uVar61 = (uint)bVar56; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x80000000) {
              iVar15 = iVar15 + 1;
            }
            bVar56 = '\x01' << ((byte)iVar15 & 0x1f);
            uVar61 = *(uint *)(local_3c0 + (uint)(iVar15 << 2));
            fVar216 = *(float *)(local_1c0 + (uint)(iVar15 << 2));
            fVar217 = local_8c8;
            if ((float)local_6c0._0_4_ < 0.0) {
              local_820[1] = 0;
              local_820[0] = bVar51;
              local_820._2_30_ = auVar74._2_30_;
              fVar217 = sqrtf((float)local_6c0._0_4_);
              bVar51 = local_820[0];
            }
            auVar235 = ZEXT464(uVar61);
            bVar50 = ~bVar56;
            lVar57 = 5;
            do {
              auVar129._4_4_ = fVar216;
              auVar129._0_4_ = fVar216;
              auVar129._8_4_ = fVar216;
              auVar129._12_4_ = fVar216;
              auVar69 = vfmadd132ps_fma(auVar129,ZEXT816(0) << 0x40,local_6b0);
              fVar233 = auVar235._0_4_;
              fVar221 = 1.0 - fVar233;
              auVar63 = SUB6416(ZEXT464(0x40400000),0);
              auVar70 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar234 = auVar235._0_16_;
              auVar62 = vfmadd213ss_fma(auVar63,auVar234,auVar70);
              auVar67 = vfmadd213ss_fma(auVar62,ZEXT416((uint)(fVar233 * fVar233)),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar68 = vfmadd213ss_fma(auVar63,ZEXT416((uint)fVar221),auVar70);
              auVar68 = vfmadd213ss_fma(auVar68,ZEXT416((uint)(fVar221 * fVar221)),
                                        SUB6416(ZEXT464(0x40000000),0));
              fVar218 = fVar221 * fVar221 * -fVar233 * 0.5;
              fVar219 = auVar67._0_4_ * 0.5;
              fVar220 = auVar68._0_4_ * 0.5;
              fVar239 = fVar233 * fVar233 * -fVar221 * 0.5;
              auVar189._0_4_ = fVar239 * (float)local_6a0._0_4_;
              auVar189._4_4_ = fVar239 * (float)local_6a0._4_4_;
              auVar189._8_4_ = fVar239 * fStack_698;
              auVar189._12_4_ = fVar239 * fStack_694;
              auVar202._4_4_ = fVar220;
              auVar202._0_4_ = fVar220;
              auVar202._8_4_ = fVar220;
              auVar202._12_4_ = fVar220;
              auVar67 = vfmadd132ps_fma(auVar202,auVar189,local_660._0_16_);
              auVar171._4_4_ = fVar219;
              auVar171._0_4_ = fVar219;
              auVar171._8_4_ = fVar219;
              auVar171._12_4_ = fVar219;
              auVar67 = vfmadd132ps_fma(auVar171,auVar67,local_680._0_16_);
              auVar190._4_4_ = fVar218;
              auVar190._0_4_ = fVar218;
              auVar190._8_4_ = fVar218;
              auVar190._12_4_ = fVar218;
              auVar67 = vfmadd132ps_fma(auVar190,auVar67,local_640._0_16_);
              auVar68 = vfmadd231ss_fma(auVar70,auVar234,ZEXT416(0x41100000));
              local_580._0_16_ = auVar68;
              local_5b0 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar234,
                                          ZEXT416(0x40800000));
              local_5c0 = vfmadd213ss_fma(auVar63,auVar234,ZEXT416(0xbf800000));
              local_560._0_16_ = auVar67;
              auVar69 = vsubps_avx(auVar69,auVar67);
              local_820._0_16_ = auVar69;
              auVar69 = vdpps_avx(auVar69,auVar69,0x7f);
              fVar218 = auVar69._0_4_;
              if (fVar218 < 0.0) {
                local_7e0._0_4_ = auVar62._0_4_;
                local_800._0_16_ = ZEXT416((uint)fVar221);
                auVar231._0_4_ = sqrtf(fVar218);
                auVar231._4_60_ = extraout_var;
                auVar62 = ZEXT416((uint)local_7e0._0_4_);
                auVar67 = auVar231._0_16_;
                auVar68 = local_800._0_16_;
              }
              else {
                auVar67 = vsqrtss_avx(auVar69,auVar69);
                auVar68 = ZEXT416((uint)fVar221);
              }
              fVar219 = auVar68._0_4_;
              auVar63 = vfnmadd231ss_fma(ZEXT416((uint)(fVar233 * (fVar219 + fVar219))),auVar68,
                                         auVar68);
              auVar62 = vfmadd213ss_fma(auVar62,ZEXT416((uint)(fVar233 + fVar233)),
                                        ZEXT416((uint)(fVar233 * fVar233 * 3.0)));
              auVar68 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar234,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar70 = vfmadd231ss_fma(ZEXT416((uint)(fVar219 * fVar219 * -3.0)),
                                        ZEXT416((uint)(fVar219 + fVar219)),auVar68);
              auVar68 = vfmadd213ss_fma(ZEXT416((uint)(fVar221 * -2.0)),auVar234,
                                        ZEXT416((uint)(fVar233 * fVar233)));
              fVar219 = auVar63._0_4_ * 0.5;
              fVar220 = auVar62._0_4_ * 0.5;
              fVar239 = auVar70._0_4_ * 0.5;
              fVar221 = auVar68._0_4_ * 0.5;
              auVar191._0_4_ = fVar221 * (float)local_6a0._0_4_;
              auVar191._4_4_ = fVar221 * (float)local_6a0._4_4_;
              auVar191._8_4_ = fVar221 * fStack_698;
              auVar191._12_4_ = fVar221 * fStack_694;
              auVar172._4_4_ = fVar239;
              auVar172._0_4_ = fVar239;
              auVar172._8_4_ = fVar239;
              auVar172._12_4_ = fVar239;
              auVar62 = vfmadd132ps_fma(auVar172,auVar191,local_660._0_16_);
              auVar150._4_4_ = fVar220;
              auVar150._0_4_ = fVar220;
              auVar150._8_4_ = fVar220;
              auVar150._12_4_ = fVar220;
              auVar62 = vfmadd132ps_fma(auVar150,auVar62,local_680._0_16_);
              auVar247._4_4_ = fVar219;
              auVar247._0_4_ = fVar219;
              auVar247._8_4_ = fVar219;
              auVar247._12_4_ = fVar219;
              local_7e0._0_16_ = vfmadd132ps_fma(auVar247,auVar62,local_640._0_16_);
              auVar62 = vdpps_avx(local_7e0._0_16_,local_7e0._0_16_,0x7f);
              auVar41._12_4_ = 0;
              auVar41._0_12_ = ZEXT812(0);
              fVar219 = auVar62._0_4_;
              auVar68 = vrsqrt14ss_avx512f(auVar41 << 0x20,ZEXT416((uint)fVar219));
              fVar220 = auVar68._0_4_;
              auVar70 = vrcp14ss_avx512f(auVar41 << 0x20,ZEXT416((uint)fVar219));
              auVar17._8_4_ = 0x80000000;
              auVar17._0_8_ = 0x8000000080000000;
              auVar17._12_4_ = 0x80000000;
              auVar63 = vxorps_avx512vl(auVar62,auVar17);
              auVar68 = vfnmadd213ss_fma(auVar70,auVar62,SUB6416(ZEXT464(0x40000000),0));
              local_800._0_4_ = auVar67._0_4_;
              if (fVar219 < auVar63._0_4_) {
                fVar239 = sqrtf(fVar219);
                auVar67 = ZEXT416((uint)local_800._0_4_);
                auVar62 = local_7e0._0_16_;
              }
              else {
                auVar62 = vsqrtss_avx(auVar62,auVar62);
                fVar239 = auVar62._0_4_;
                auVar62 = local_7e0._0_16_;
              }
              fVar220 = fVar220 * 1.5 + fVar219 * -0.5 * fVar220 * fVar220 * fVar220;
              auVar130._0_4_ = auVar62._0_4_ * fVar220;
              auVar130._4_4_ = auVar62._4_4_ * fVar220;
              auVar130._8_4_ = auVar62._8_4_ * fVar220;
              auVar130._12_4_ = auVar62._12_4_ * fVar220;
              auVar63 = vdpps_avx(local_820._0_16_,auVar130,0x7f);
              fVar222 = auVar67._0_4_;
              auVar131._0_4_ = auVar63._0_4_ * auVar63._0_4_;
              auVar131._4_4_ = auVar63._4_4_ * auVar63._4_4_;
              auVar131._8_4_ = auVar63._8_4_ * auVar63._8_4_;
              auVar131._12_4_ = auVar63._12_4_ * auVar63._12_4_;
              auVar64 = vsubps_avx512vl(auVar69,auVar131);
              fVar221 = auVar64._0_4_;
              auVar151._4_12_ = ZEXT812(0) << 0x20;
              auVar151._0_4_ = fVar221;
              auVar71 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar151);
              auVar72 = vmulss_avx512f(auVar71,ZEXT416(0x3fc00000));
              if (fVar221 < 0.0) {
                local_5f0 = fVar220;
                fStack_5ec = fVar220;
                fStack_5e8 = fVar220;
                fStack_5e4 = fVar220;
                local_5e0 = auVar71;
                local_5d0 = auVar63;
                fVar125 = sqrtf(fVar221);
                auVar72 = ZEXT416(auVar72._0_4_);
                auVar67 = ZEXT416((uint)local_800._0_4_);
                auVar62 = local_7e0._0_16_;
                auVar63 = local_5d0;
                auVar71 = local_5e0;
                fVar220 = local_5f0;
                fVar227 = fStack_5ec;
                fVar228 = fStack_5e8;
                fVar232 = fStack_5e4;
              }
              else {
                auVar64 = vsqrtss_avx(auVar64,auVar64);
                fVar125 = auVar64._0_4_;
                fVar227 = fVar220;
                fVar228 = fVar220;
                fVar232 = fVar220;
              }
              auVar242 = ZEXT1664(local_820._0_16_);
              auVar229._8_4_ = 0x7fffffff;
              auVar229._0_8_ = 0x7fffffff7fffffff;
              auVar229._12_4_ = 0x7fffffff;
              auVar231 = ZEXT1664(auVar229);
              auVar252 = ZEXT3264(local_860);
              auVar253 = ZEXT3264(local_880);
              auVar257 = ZEXT3264(local_780);
              auVar259 = ZEXT3264(local_7a0);
              auVar249 = ZEXT3264(local_7c0);
              auVar152._0_4_ = (float)local_5c0._0_4_ * (float)local_6a0._0_4_;
              auVar152._4_4_ = (float)local_5c0._0_4_ * (float)local_6a0._4_4_;
              auVar152._8_4_ = (float)local_5c0._0_4_ * fStack_698;
              auVar152._12_4_ = (float)local_5c0._0_4_ * fStack_694;
              auVar173._4_4_ = local_5b0._0_4_;
              auVar173._0_4_ = local_5b0._0_4_;
              auVar173._8_4_ = local_5b0._0_4_;
              auVar173._12_4_ = local_5b0._0_4_;
              auVar64 = vfmadd132ps_fma(auVar173,auVar152,local_660._0_16_);
              auVar153._4_4_ = local_580._0_4_;
              auVar153._0_4_ = local_580._0_4_;
              auVar153._8_4_ = local_580._0_4_;
              auVar153._12_4_ = local_580._0_4_;
              auVar64 = vfmadd132ps_fma(auVar153,auVar64,local_680._0_16_);
              auVar234 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar234,ZEXT416(0x40000000)
                                        );
              auVar174._0_4_ = auVar234._0_4_;
              auVar174._4_4_ = auVar174._0_4_;
              auVar174._8_4_ = auVar174._0_4_;
              auVar174._12_4_ = auVar174._0_4_;
              auVar234 = vfmadd132ps_fma(auVar174,auVar64,local_640._0_16_);
              auVar154._0_4_ = auVar234._0_4_ * fVar219;
              auVar154._4_4_ = auVar234._4_4_ * fVar219;
              auVar154._8_4_ = auVar234._8_4_ * fVar219;
              auVar154._12_4_ = auVar234._12_4_ * fVar219;
              auVar234 = vdpps_avx(auVar62,auVar234,0x7f);
              fVar219 = auVar234._0_4_;
              auVar175._0_4_ = auVar62._0_4_ * fVar219;
              auVar175._4_4_ = auVar62._4_4_ * fVar219;
              auVar175._8_4_ = auVar62._8_4_ * fVar219;
              auVar175._12_4_ = auVar62._12_4_ * fVar219;
              auVar64 = vsubps_avx(auVar154,auVar175);
              local_920 = auVar70._0_4_;
              local_920 = auVar68._0_4_ * local_920;
              auVar234 = vmaxss_avx(ZEXT416((uint)fVar210),
                                    ZEXT416((uint)(fVar216 * fVar217 * 1.9073486e-06)));
              auVar18._8_4_ = 0x80000000;
              auVar18._0_8_ = 0x8000000080000000;
              auVar18._12_4_ = 0x80000000;
              auVar113._16_16_ = local_7c0._16_16_;
              auVar73 = vxorps_avx512vl(auVar62,auVar18);
              auVar176._0_4_ = fVar220 * auVar64._0_4_ * local_920;
              auVar176._4_4_ = fVar227 * auVar64._4_4_ * local_920;
              auVar176._8_4_ = fVar228 * auVar64._8_4_ * local_920;
              auVar176._12_4_ = fVar232 * auVar64._12_4_ * local_920;
              auVar68 = vdpps_avx(auVar73,auVar130,0x7f);
              auVar70 = vfmadd213ss_fma(auVar67,ZEXT416((uint)fVar210),auVar234);
              auVar67 = vdpps_avx(local_820._0_16_,auVar176,0x7f);
              auVar64 = vfmadd213ss_fma(ZEXT416((uint)(fVar222 + 1.0)),
                                        ZEXT416((uint)(fVar210 / fVar239)),auVar70);
              fVar219 = auVar68._0_4_ + auVar67._0_4_;
              auVar67 = vdpps_avx(local_6b0,auVar130,0x7f);
              auVar68 = vdpps_avx(local_820._0_16_,auVar73,0x7f);
              auVar70 = vmulss_avx512f(auVar71,ZEXT416((uint)(fVar221 * -0.5)));
              auVar71 = vmulss_avx512f(auVar71,auVar71);
              auVar73 = vaddss_avx512f(auVar72,ZEXT416((uint)(auVar70._0_4_ * auVar71._0_4_)));
              auVar70 = vdpps_avx(local_820._0_16_,local_6b0,0x7f);
              auVar71 = vfnmadd231ss_fma(auVar68,auVar63,ZEXT416((uint)fVar219));
              auVar72 = vfnmadd231ss_fma(auVar70,auVar63,auVar67);
              auVar68 = vpermilps_avx(local_560._0_16_,0xff);
              fVar125 = fVar125 - auVar68._0_4_;
              auVar68 = vshufps_avx(auVar62,auVar62,0xff);
              auVar70 = vfmsub213ss_fma(auVar71,auVar73,auVar68);
              fVar220 = auVar72._0_4_ * auVar73._0_4_;
              auVar71 = vfmsub231ss_fma(ZEXT416((uint)(auVar67._0_4_ * auVar70._0_4_)),
                                        ZEXT416((uint)fVar219),ZEXT416((uint)fVar220));
              fVar239 = auVar71._0_4_;
              fVar233 = fVar233 - (auVar63._0_4_ * (fVar220 / fVar239) -
                                  fVar125 * (auVar67._0_4_ / fVar239));
              auVar235 = ZEXT464((uint)fVar233);
              fVar216 = fVar216 - (fVar125 * (fVar219 / fVar239) -
                                  auVar63._0_4_ * (auVar70._0_4_ / fVar239));
              auVar67 = vandps_avx(auVar63,auVar229);
              bVar58 = true;
              if (auVar64._0_4_ <= auVar67._0_4_) {
LAB_01b50fb4:
                auVar255 = ZEXT3264(local_840);
              }
              else {
                auVar70 = vfmadd231ss_fma(ZEXT416((uint)(auVar64._0_4_ + auVar234._0_4_)),local_610,
                                          ZEXT416(0x36000000));
                auVar67 = vandps_avx(auVar229,ZEXT416((uint)fVar125));
                if (auVar70._0_4_ <= auVar67._0_4_) goto LAB_01b50fb4;
                fVar216 = fVar216 + (float)local_600._0_4_;
                if ((((fVar216 < fVar147) ||
                     (fVar219 = *(float *)(ray + k * 4 + 0x80), fVar219 < fVar216)) ||
                    (fVar233 < 0.0)) || (1.0 < fVar233)) {
LAB_01b50fb1:
                  bVar58 = false;
                  bVar56 = 0;
                  goto LAB_01b50fb4;
                }
                auVar113._0_16_ = ZEXT816(0) << 0x20;
                auVar112._4_28_ = auVar113._4_28_;
                auVar112._0_4_ = fVar218;
                auVar67 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar112._0_16_);
                fVar218 = auVar67._0_4_;
                auVar69 = vmulss_avx512f(auVar69,ZEXT416(0xbf000000));
                pGVar3 = (context->scene->geometries).items[local_8e8].ptr;
                if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) goto LAB_01b50fb1;
                auVar255 = ZEXT3264(local_840);
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar56 = true;
                }
                else {
                  fVar218 = fVar218 * 1.5 + auVar69._0_4_ * fVar218 * fVar218 * fVar218;
                  auVar155._0_4_ = local_820._0_4_ * fVar218;
                  auVar155._4_4_ = local_820._4_4_ * fVar218;
                  auVar155._8_4_ = local_820._8_4_ * fVar218;
                  auVar155._12_4_ = local_820._12_4_ * fVar218;
                  auVar68 = vfmadd213ps_fma(auVar68,auVar155,auVar62);
                  auVar69 = vshufps_avx(auVar155,auVar155,0xc9);
                  auVar67 = vshufps_avx(auVar62,auVar62,0xc9);
                  auVar156._0_4_ = auVar155._0_4_ * auVar67._0_4_;
                  auVar156._4_4_ = auVar155._4_4_ * auVar67._4_4_;
                  auVar156._8_4_ = auVar155._8_4_ * auVar67._8_4_;
                  auVar156._12_4_ = auVar155._12_4_ * auVar67._12_4_;
                  auVar62 = vfmsub231ps_fma(auVar156,auVar62,auVar69);
                  auVar69 = vshufps_avx(auVar62,auVar62,0xc9);
                  auVar67 = vshufps_avx(auVar68,auVar68,0xc9);
                  auVar62 = vshufps_avx(auVar62,auVar62,0xd2);
                  auVar132._0_4_ = auVar68._0_4_ * auVar62._0_4_;
                  auVar132._4_4_ = auVar68._4_4_ * auVar62._4_4_;
                  auVar132._8_4_ = auVar68._8_4_ * auVar62._8_4_;
                  auVar132._12_4_ = auVar68._12_4_ * auVar62._12_4_;
                  auVar69 = vfmsub231ps_fma(auVar132,auVar69,auVar67);
                  local_500 = (RTCHitN  [16])vshufps_avx(auVar69,auVar69,0x55);
                  auStack_4f0 = vshufps_avx(auVar69,auVar69,0xaa);
                  local_4e0 = auVar69._0_4_;
                  uStack_4dc = local_4e0;
                  uStack_4d8 = local_4e0;
                  uStack_4d4 = local_4e0;
                  local_4d0 = fVar233;
                  fStack_4cc = fVar233;
                  fStack_4c8 = fVar233;
                  fStack_4c4 = fVar233;
                  local_4c0 = ZEXT416(0) << 0x20;
                  local_4b0 = local_510._0_8_;
                  uStack_4a8 = local_510._8_8_;
                  local_4a0 = local_520;
                  vpcmpeqd_avx2(ZEXT1632(local_520),ZEXT1632(local_520));
                  uStack_48c = context->user->instID[0];
                  local_490 = uStack_48c;
                  uStack_488 = uStack_48c;
                  uStack_484 = uStack_48c;
                  uStack_480 = context->user->instPrimID[0];
                  uStack_47c = uStack_480;
                  uStack_478 = uStack_480;
                  uStack_474 = uStack_480;
                  *(float *)(ray + k * 4 + 0x80) = fVar216;
                  local_900 = local_530._0_8_;
                  uStack_8f8 = local_530._8_8_;
                  local_710.valid = (int *)&local_900;
                  local_710.geometryUserPtr = pGVar3->userPtr;
                  local_710.context = context->user;
                  local_710.hit = local_500;
                  local_710.N = 4;
                  local_710.ray = (RTCRayN *)ray;
                  if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar242 = ZEXT1664(local_820._0_16_);
                    (*pGVar3->occlusionFilterN)(&local_710);
                    auVar235 = ZEXT1664(ZEXT416((uint)fVar233));
                    auVar249 = ZEXT3264(local_7c0);
                    auVar259 = ZEXT3264(local_7a0);
                    auVar257 = ZEXT3264(local_780);
                    auVar253 = ZEXT3264(local_880);
                    auVar252 = ZEXT3264(local_860);
                    auVar255 = ZEXT3264(local_840);
                    auVar231 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)
                                                 ));
                  }
                  auVar43._8_8_ = uStack_8f8;
                  auVar43._0_8_ = local_900;
                  uVar60 = vptestmd_avx512vl(auVar43,auVar43);
                  if ((uVar60 & 0xf) == 0) {
                    bVar56 = false;
                  }
                  else {
                    p_Var4 = context->args->filter;
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar242 = ZEXT1664(auVar242._0_16_);
                      (*p_Var4)(&local_710);
                      auVar235 = ZEXT1664(ZEXT416((uint)fVar233));
                      auVar249 = ZEXT3264(local_7c0);
                      auVar259 = ZEXT3264(local_7a0);
                      auVar257 = ZEXT3264(local_780);
                      auVar253 = ZEXT3264(local_880);
                      auVar252 = ZEXT3264(local_860);
                      auVar255 = ZEXT3264(local_840);
                      auVar231 = ZEXT1664(CONCAT412(0x7fffffff,
                                                    CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                    }
                    auVar44._8_8_ = uStack_8f8;
                    auVar44._0_8_ = local_900;
                    uVar60 = vptestmd_avx512vl(auVar44,auVar44);
                    uVar60 = uVar60 & 0xf;
                    auVar69 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar58 = (bool)((byte)uVar60 & 1);
                    bVar5 = (bool)((byte)(uVar60 >> 1) & 1);
                    bVar6 = (bool)((byte)(uVar60 >> 2) & 1);
                    bVar7 = SUB81(uVar60 >> 3,0);
                    *(uint *)(local_710.ray + 0x80) =
                         (uint)bVar58 * auVar69._0_4_ |
                         (uint)!bVar58 * *(int *)(local_710.ray + 0x80);
                    *(uint *)(local_710.ray + 0x84) =
                         (uint)bVar5 * auVar69._4_4_ | (uint)!bVar5 * *(int *)(local_710.ray + 0x84)
                    ;
                    *(uint *)(local_710.ray + 0x88) =
                         (uint)bVar6 * auVar69._8_4_ | (uint)!bVar6 * *(int *)(local_710.ray + 0x88)
                    ;
                    *(uint *)(local_710.ray + 0x8c) =
                         (uint)bVar7 * auVar69._12_4_ |
                         (uint)!bVar7 * *(int *)(local_710.ray + 0x8c);
                    bVar56 = (byte)uVar60 != 0;
                  }
                  if ((bool)bVar56 == false) {
                    *(float *)(ray + k * 4 + 0x80) = fVar219;
                  }
                }
                bVar58 = false;
              }
              if (!bVar58) goto LAB_01b51378;
              lVar57 = lVar57 + -1;
            } while (lVar57 != 0);
            bVar56 = 0;
LAB_01b51378:
            bVar55 = bVar55 | bVar56 & 1;
            auVar47._4_4_ = fStack_3fc;
            auVar47._0_4_ = local_400;
            auVar47._8_4_ = fStack_3f8;
            auVar47._12_4_ = fStack_3f4;
            auVar47._16_4_ = fStack_3f0;
            auVar47._20_4_ = fStack_3ec;
            auVar47._24_4_ = fStack_3e8;
            auVar47._28_4_ = fStack_3e4;
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar28._4_4_ = uVar1;
            auVar28._0_4_ = uVar1;
            auVar28._8_4_ = uVar1;
            auVar28._12_4_ = uVar1;
            auVar28._16_4_ = uVar1;
            auVar28._20_4_ = uVar1;
            auVar28._24_4_ = uVar1;
            auVar28._28_4_ = uVar1;
            uVar12 = vcmpps_avx512vl(auVar47,auVar28,2);
            bVar51 = bVar50 & bVar51 & (byte)uVar12;
          } while (bVar51 != 0);
        }
        auVar143._0_4_ = (float)local_440._0_4_ + (float)local_420._0_4_;
        auVar143._4_4_ = (float)local_440._4_4_ + (float)local_420._4_4_;
        auVar143._8_4_ = fStack_438 + fStack_418;
        auVar143._12_4_ = fStack_434 + fStack_414;
        auVar143._16_4_ = fStack_430 + fStack_410;
        auVar143._20_4_ = fStack_42c + fStack_40c;
        auVar143._24_4_ = fStack_428 + fStack_408;
        auVar143._28_4_ = fStack_424 + fStack_404;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar29._4_4_ = uVar1;
        auVar29._0_4_ = uVar1;
        auVar29._8_4_ = uVar1;
        auVar29._12_4_ = uVar1;
        auVar29._16_4_ = uVar1;
        auVar29._20_4_ = uVar1;
        auVar29._24_4_ = uVar1;
        auVar29._28_4_ = uVar1;
        uVar12 = vcmpps_avx512vl(auVar143,auVar29,2);
        bVar56 = (byte)local_8cc | (byte)local_8d4;
        bVar53 = (byte)uVar13 & bVar53 & (byte)uVar12;
        auVar144._8_4_ = 2;
        auVar144._0_8_ = 0x200000002;
        auVar144._12_4_ = 2;
        auVar144._16_4_ = 2;
        auVar144._20_4_ = 2;
        auVar144._24_4_ = 2;
        auVar144._28_4_ = 2;
        auVar30._8_4_ = 3;
        auVar30._0_8_ = 0x300000003;
        auVar30._12_4_ = 3;
        auVar30._16_4_ = 3;
        auVar30._20_4_ = 3;
        auVar30._24_4_ = 3;
        auVar30._28_4_ = 3;
        auVar77 = vpblendmd_avx512vl(auVar144,auVar30);
        local_420._0_4_ = (uint)(bVar56 & 1) * auVar77._0_4_ | (uint)!(bool)(bVar56 & 1) * 2;
        bVar58 = (bool)(bVar56 >> 1 & 1);
        local_420._4_4_ = (uint)bVar58 * auVar77._4_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar56 >> 2 & 1);
        fStack_418 = (float)((uint)bVar58 * auVar77._8_4_ | (uint)!bVar58 * 2);
        bVar58 = (bool)(bVar56 >> 3 & 1);
        fStack_414 = (float)((uint)bVar58 * auVar77._12_4_ | (uint)!bVar58 * 2);
        bVar58 = (bool)(bVar56 >> 4 & 1);
        fStack_410 = (float)((uint)bVar58 * auVar77._16_4_ | (uint)!bVar58 * 2);
        bVar58 = (bool)(bVar56 >> 5 & 1);
        fStack_40c = (float)((uint)bVar58 * auVar77._20_4_ | (uint)!bVar58 * 2);
        bVar58 = (bool)(bVar56 >> 6 & 1);
        fStack_408 = (float)((uint)bVar58 * auVar77._24_4_ | (uint)!bVar58 * 2);
        fStack_404 = (float)((uint)(bVar56 >> 7) * auVar77._28_4_ | (uint)!(bool)(bVar56 >> 7) * 2);
        uVar12 = vpcmpd_avx512vl(_local_420,local_380,2);
        bVar56 = (byte)uVar12 & bVar53;
        if (bVar56 == 0) {
          auVar256 = ZEXT3264(local_8a0);
          auVar254 = ZEXT3264(local_8c0);
          auVar250 = ZEXT3264(local_740);
          auVar251 = ZEXT3264(local_760);
          auVar258 = ZEXT3264(local_6e0);
        }
        else {
          auVar67 = vminps_avx(local_640._0_16_,local_680._0_16_);
          auVar69 = vmaxps_avx(local_640._0_16_,local_680._0_16_);
          auVar62 = vminps_avx(local_660._0_16_,local_6a0._0_16_);
          auVar68 = vminps_avx(auVar67,auVar62);
          auVar67 = vmaxps_avx(local_660._0_16_,local_6a0._0_16_);
          auVar62 = vmaxps_avx(auVar69,auVar67);
          auVar69 = vandps_avx(auVar231._0_16_,auVar68);
          auVar67 = vandps_avx(auVar231._0_16_,auVar62);
          auVar69 = vmaxps_avx(auVar69,auVar67);
          auVar67 = vmovshdup_avx(auVar69);
          auVar67 = vmaxss_avx(auVar67,auVar69);
          auVar69 = vshufpd_avx(auVar69,auVar69,1);
          auVar69 = vmaxss_avx(auVar69,auVar67);
          fVar210 = auVar69._0_4_ * 1.9073486e-06;
          local_610 = vshufps_avx(auVar62,auVar62,0xff);
          _local_5a0 = _local_320;
          local_400 = (float)local_440._0_4_ + (float)local_320._0_4_;
          fStack_3fc = (float)local_440._4_4_ + (float)local_320._4_4_;
          fStack_3f8 = fStack_438 + fStack_318;
          fStack_3f4 = fStack_434 + fStack_314;
          fStack_3f0 = fStack_430 + fStack_310;
          fStack_3ec = fStack_42c + fStack_30c;
          fStack_3e8 = fStack_428 + fStack_308;
          fStack_3e4 = fStack_424 + fStack_304;
          do {
            auVar74 = local_820;
            auVar145._8_4_ = 0x7f800000;
            auVar145._0_8_ = 0x7f8000007f800000;
            auVar145._12_4_ = 0x7f800000;
            auVar145._16_4_ = 0x7f800000;
            auVar145._20_4_ = 0x7f800000;
            auVar145._24_4_ = 0x7f800000;
            auVar145._28_4_ = 0x7f800000;
            auVar77 = vblendmps_avx512vl(auVar145,_local_5a0);
            auVar114._0_4_ =
                 (uint)(bVar56 & 1) * auVar77._0_4_ | (uint)!(bool)(bVar56 & 1) * 0x7f800000;
            bVar58 = (bool)(bVar56 >> 1 & 1);
            auVar114._4_4_ = (uint)bVar58 * auVar77._4_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar56 >> 2 & 1);
            auVar114._8_4_ = (uint)bVar58 * auVar77._8_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar56 >> 3 & 1);
            auVar114._12_4_ = (uint)bVar58 * auVar77._12_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar56 >> 4 & 1);
            auVar114._16_4_ = (uint)bVar58 * auVar77._16_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar56 >> 5 & 1);
            auVar114._20_4_ = (uint)bVar58 * auVar77._20_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar56 >> 6 & 1);
            auVar114._24_4_ = (uint)bVar58 * auVar77._24_4_ | (uint)!bVar58 * 0x7f800000;
            auVar114._28_4_ =
                 (uint)(bVar56 >> 7) * auVar77._28_4_ | (uint)!(bool)(bVar56 >> 7) * 0x7f800000;
            auVar77 = vshufps_avx(auVar114,auVar114,0xb1);
            auVar77 = vminps_avx(auVar114,auVar77);
            auVar75 = vshufpd_avx(auVar77,auVar77,5);
            auVar77 = vminps_avx(auVar77,auVar75);
            auVar75 = vpermpd_avx2(auVar77,0x4e);
            auVar77 = vminps_avx(auVar77,auVar75);
            uVar12 = vcmpps_avx512vl(auVar114,auVar77,0);
            bVar50 = (byte)uVar12 & bVar56;
            bVar51 = bVar56;
            if (bVar50 != 0) {
              bVar51 = bVar50;
            }
            iVar15 = 0;
            for (uVar61 = (uint)bVar51; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x80000000) {
              iVar15 = iVar15 + 1;
            }
            bVar51 = '\x01' << ((byte)iVar15 & 0x1f);
            uVar61 = *(uint *)(local_3e0 + (uint)(iVar15 << 2));
            fVar216 = *(float *)(local_300 + (uint)(iVar15 << 2));
            fVar217 = local_8c4;
            if ((float)local_6c0._0_4_ < 0.0) {
              local_820[1] = 0;
              local_820[0] = bVar56;
              local_820._2_30_ = auVar74._2_30_;
              fVar217 = sqrtf((float)local_6c0._0_4_);
              bVar56 = local_820[0];
            }
            auVar235 = ZEXT464(uVar61);
            bVar50 = ~bVar51;
            lVar57 = 5;
            do {
              auVar133._4_4_ = fVar216;
              auVar133._0_4_ = fVar216;
              auVar133._8_4_ = fVar216;
              auVar133._12_4_ = fVar216;
              auVar69 = vfmadd132ps_fma(auVar133,ZEXT816(0) << 0x40,local_6b0);
              fVar233 = auVar235._0_4_;
              fVar221 = 1.0 - fVar233;
              auVar63 = SUB6416(ZEXT464(0x40400000),0);
              auVar70 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar234 = auVar235._0_16_;
              auVar62 = vfmadd213ss_fma(auVar63,auVar234,auVar70);
              auVar67 = vfmadd213ss_fma(auVar62,ZEXT416((uint)(fVar233 * fVar233)),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar68 = vfmadd213ss_fma(auVar63,ZEXT416((uint)fVar221),auVar70);
              auVar68 = vfmadd213ss_fma(auVar68,ZEXT416((uint)(fVar221 * fVar221)),
                                        SUB6416(ZEXT464(0x40000000),0));
              fVar218 = fVar221 * fVar221 * -fVar233 * 0.5;
              fVar219 = auVar67._0_4_ * 0.5;
              fVar220 = auVar68._0_4_ * 0.5;
              fVar239 = fVar233 * fVar233 * -fVar221 * 0.5;
              auVar192._0_4_ = fVar239 * (float)local_6a0._0_4_;
              auVar192._4_4_ = fVar239 * (float)local_6a0._4_4_;
              auVar192._8_4_ = fVar239 * fStack_698;
              auVar192._12_4_ = fVar239 * fStack_694;
              auVar203._4_4_ = fVar220;
              auVar203._0_4_ = fVar220;
              auVar203._8_4_ = fVar220;
              auVar203._12_4_ = fVar220;
              auVar67 = vfmadd132ps_fma(auVar203,auVar192,local_660._0_16_);
              auVar177._4_4_ = fVar219;
              auVar177._0_4_ = fVar219;
              auVar177._8_4_ = fVar219;
              auVar177._12_4_ = fVar219;
              auVar67 = vfmadd132ps_fma(auVar177,auVar67,local_680._0_16_);
              auVar193._4_4_ = fVar218;
              auVar193._0_4_ = fVar218;
              auVar193._8_4_ = fVar218;
              auVar193._12_4_ = fVar218;
              auVar67 = vfmadd132ps_fma(auVar193,auVar67,local_640._0_16_);
              auVar68 = vfmadd231ss_fma(auVar70,auVar234,ZEXT416(0x41100000));
              local_580._0_16_ = auVar68;
              local_5b0 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar234,
                                          ZEXT416(0x40800000));
              local_5c0 = vfmadd213ss_fma(auVar63,auVar234,ZEXT416(0xbf800000));
              local_560._0_16_ = auVar67;
              auVar69 = vsubps_avx(auVar69,auVar67);
              local_820._0_16_ = auVar69;
              auVar69 = vdpps_avx(auVar69,auVar69,0x7f);
              fVar218 = auVar69._0_4_;
              if (fVar218 < 0.0) {
                local_7e0._0_4_ = auVar62._0_4_;
                local_800._0_16_ = ZEXT416((uint)fVar221);
                auVar235._0_4_ = sqrtf(fVar218);
                auVar235._4_60_ = extraout_var_00;
                auVar62 = ZEXT416((uint)local_7e0._0_4_);
                auVar67 = auVar235._0_16_;
                auVar68 = local_800._0_16_;
              }
              else {
                auVar67 = vsqrtss_avx(auVar69,auVar69);
                auVar68 = ZEXT416((uint)fVar221);
              }
              fVar219 = auVar68._0_4_;
              auVar63 = vfnmadd231ss_fma(ZEXT416((uint)(fVar233 * (fVar219 + fVar219))),auVar68,
                                         auVar68);
              auVar62 = vfmadd213ss_fma(auVar62,ZEXT416((uint)(fVar233 + fVar233)),
                                        ZEXT416((uint)(fVar233 * fVar233 * 3.0)));
              auVar68 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar234,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar70 = vfmadd231ss_fma(ZEXT416((uint)(fVar219 * fVar219 * -3.0)),
                                        ZEXT416((uint)(fVar219 + fVar219)),auVar68);
              auVar68 = vfmadd213ss_fma(ZEXT416((uint)(fVar221 * -2.0)),auVar234,
                                        ZEXT416((uint)(fVar233 * fVar233)));
              fVar219 = auVar63._0_4_ * 0.5;
              fVar220 = auVar62._0_4_ * 0.5;
              fVar239 = auVar70._0_4_ * 0.5;
              fVar221 = auVar68._0_4_ * 0.5;
              auVar194._0_4_ = fVar221 * (float)local_6a0._0_4_;
              auVar194._4_4_ = fVar221 * (float)local_6a0._4_4_;
              auVar194._8_4_ = fVar221 * fStack_698;
              auVar194._12_4_ = fVar221 * fStack_694;
              auVar178._4_4_ = fVar239;
              auVar178._0_4_ = fVar239;
              auVar178._8_4_ = fVar239;
              auVar178._12_4_ = fVar239;
              auVar62 = vfmadd132ps_fma(auVar178,auVar194,local_660._0_16_);
              auVar157._4_4_ = fVar220;
              auVar157._0_4_ = fVar220;
              auVar157._8_4_ = fVar220;
              auVar157._12_4_ = fVar220;
              auVar62 = vfmadd132ps_fma(auVar157,auVar62,local_680._0_16_);
              auVar248._4_4_ = fVar219;
              auVar248._0_4_ = fVar219;
              auVar248._8_4_ = fVar219;
              auVar248._12_4_ = fVar219;
              local_7e0._0_16_ = vfmadd132ps_fma(auVar248,auVar62,local_640._0_16_);
              auVar62 = vdpps_avx(local_7e0._0_16_,local_7e0._0_16_,0x7f);
              auVar42._12_4_ = 0;
              auVar42._0_12_ = ZEXT812(0);
              fVar219 = auVar62._0_4_;
              auVar68 = vrsqrt14ss_avx512f(auVar42 << 0x20,ZEXT416((uint)fVar219));
              fVar220 = auVar68._0_4_;
              auVar70 = vrcp14ss_avx512f(auVar42 << 0x20,ZEXT416((uint)fVar219));
              auVar19._8_4_ = 0x80000000;
              auVar19._0_8_ = 0x8000000080000000;
              auVar19._12_4_ = 0x80000000;
              auVar63 = vxorps_avx512vl(auVar62,auVar19);
              auVar68 = vfnmadd213ss_fma(auVar70,auVar62,SUB6416(ZEXT464(0x40000000),0));
              local_800._0_4_ = auVar67._0_4_;
              if (fVar219 < auVar63._0_4_) {
                fVar239 = sqrtf(fVar219);
                auVar67 = ZEXT416((uint)local_800._0_4_);
                auVar62 = local_7e0._0_16_;
              }
              else {
                auVar62 = vsqrtss_avx(auVar62,auVar62);
                fVar239 = auVar62._0_4_;
                auVar62 = local_7e0._0_16_;
              }
              fVar220 = fVar220 * 1.5 + fVar219 * -0.5 * fVar220 * fVar220 * fVar220;
              auVar134._0_4_ = auVar62._0_4_ * fVar220;
              auVar134._4_4_ = auVar62._4_4_ * fVar220;
              auVar134._8_4_ = auVar62._8_4_ * fVar220;
              auVar134._12_4_ = auVar62._12_4_ * fVar220;
              auVar63 = vdpps_avx(local_820._0_16_,auVar134,0x7f);
              fVar222 = auVar67._0_4_;
              auVar135._0_4_ = auVar63._0_4_ * auVar63._0_4_;
              auVar135._4_4_ = auVar63._4_4_ * auVar63._4_4_;
              auVar135._8_4_ = auVar63._8_4_ * auVar63._8_4_;
              auVar135._12_4_ = auVar63._12_4_ * auVar63._12_4_;
              auVar64 = vsubps_avx512vl(auVar69,auVar135);
              fVar221 = auVar64._0_4_;
              auVar158._4_12_ = ZEXT812(0) << 0x20;
              auVar158._0_4_ = fVar221;
              auVar71 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar158);
              auVar72 = vmulss_avx512f(auVar71,ZEXT416(0x3fc00000));
              if (fVar221 < 0.0) {
                local_5f0 = fVar220;
                fStack_5ec = fVar220;
                fStack_5e8 = fVar220;
                fStack_5e4 = fVar220;
                local_5e0 = auVar71;
                local_5d0 = auVar63;
                fVar125 = sqrtf(fVar221);
                auVar72 = ZEXT416(auVar72._0_4_);
                auVar67 = ZEXT416((uint)local_800._0_4_);
                auVar62 = local_7e0._0_16_;
                auVar63 = local_5d0;
                auVar71 = local_5e0;
                fVar220 = local_5f0;
                fVar227 = fStack_5ec;
                fVar228 = fStack_5e8;
                fVar232 = fStack_5e4;
              }
              else {
                auVar64 = vsqrtss_avx(auVar64,auVar64);
                fVar125 = auVar64._0_4_;
                fVar227 = fVar220;
                fVar228 = fVar220;
                fVar232 = fVar220;
              }
              auVar242 = ZEXT1664(local_820._0_16_);
              auVar230._8_4_ = 0x7fffffff;
              auVar230._0_8_ = 0x7fffffff7fffffff;
              auVar230._12_4_ = 0x7fffffff;
              auVar231 = ZEXT1664(auVar230);
              auVar255 = ZEXT3264(local_840);
              auVar252 = ZEXT3264(local_860);
              auVar250 = ZEXT3264(local_740);
              auVar251 = ZEXT3264(local_760);
              auVar253 = ZEXT3264(local_880);
              auVar256 = ZEXT3264(local_8a0);
              auVar254 = ZEXT3264(local_8c0);
              auVar257 = ZEXT3264(local_780);
              auVar259 = ZEXT3264(local_7a0);
              auVar258 = ZEXT3264(local_6e0);
              auVar249 = ZEXT3264(local_7c0);
              auVar159._0_4_ = (float)local_5c0._0_4_ * (float)local_6a0._0_4_;
              auVar159._4_4_ = (float)local_5c0._0_4_ * (float)local_6a0._4_4_;
              auVar159._8_4_ = (float)local_5c0._0_4_ * fStack_698;
              auVar159._12_4_ = (float)local_5c0._0_4_ * fStack_694;
              auVar179._4_4_ = local_5b0._0_4_;
              auVar179._0_4_ = local_5b0._0_4_;
              auVar179._8_4_ = local_5b0._0_4_;
              auVar179._12_4_ = local_5b0._0_4_;
              auVar64 = vfmadd132ps_fma(auVar179,auVar159,local_660._0_16_);
              auVar160._4_4_ = local_580._0_4_;
              auVar160._0_4_ = local_580._0_4_;
              auVar160._8_4_ = local_580._0_4_;
              auVar160._12_4_ = local_580._0_4_;
              auVar64 = vfmadd132ps_fma(auVar160,auVar64,local_680._0_16_);
              auVar234 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar234,ZEXT416(0x40000000)
                                        );
              auVar180._0_4_ = auVar234._0_4_;
              auVar180._4_4_ = auVar180._0_4_;
              auVar180._8_4_ = auVar180._0_4_;
              auVar180._12_4_ = auVar180._0_4_;
              auVar234 = vfmadd132ps_fma(auVar180,auVar64,local_640._0_16_);
              auVar161._0_4_ = auVar234._0_4_ * fVar219;
              auVar161._4_4_ = auVar234._4_4_ * fVar219;
              auVar161._8_4_ = auVar234._8_4_ * fVar219;
              auVar161._12_4_ = auVar234._12_4_ * fVar219;
              auVar234 = vdpps_avx(auVar62,auVar234,0x7f);
              fVar219 = auVar234._0_4_;
              auVar181._0_4_ = auVar62._0_4_ * fVar219;
              auVar181._4_4_ = auVar62._4_4_ * fVar219;
              auVar181._8_4_ = auVar62._8_4_ * fVar219;
              auVar181._12_4_ = auVar62._12_4_ * fVar219;
              auVar64 = vsubps_avx(auVar161,auVar181);
              local_920 = auVar70._0_4_;
              local_920 = auVar68._0_4_ * local_920;
              auVar234 = vmaxss_avx(ZEXT416((uint)fVar210),
                                    ZEXT416((uint)(fVar216 * fVar217 * 1.9073486e-06)));
              auVar20._8_4_ = 0x80000000;
              auVar20._0_8_ = 0x8000000080000000;
              auVar20._12_4_ = 0x80000000;
              auVar116._16_16_ = local_7c0._16_16_;
              auVar73 = vxorps_avx512vl(auVar62,auVar20);
              auVar182._0_4_ = fVar220 * auVar64._0_4_ * local_920;
              auVar182._4_4_ = fVar227 * auVar64._4_4_ * local_920;
              auVar182._8_4_ = fVar228 * auVar64._8_4_ * local_920;
              auVar182._12_4_ = fVar232 * auVar64._12_4_ * local_920;
              auVar68 = vdpps_avx(auVar73,auVar134,0x7f);
              auVar70 = vfmadd213ss_fma(auVar67,ZEXT416((uint)fVar210),auVar234);
              auVar67 = vdpps_avx(local_820._0_16_,auVar182,0x7f);
              auVar64 = vfmadd213ss_fma(ZEXT416((uint)(fVar222 + 1.0)),
                                        ZEXT416((uint)(fVar210 / fVar239)),auVar70);
              fVar219 = auVar68._0_4_ + auVar67._0_4_;
              auVar67 = vdpps_avx(local_6b0,auVar134,0x7f);
              auVar68 = vdpps_avx(local_820._0_16_,auVar73,0x7f);
              auVar70 = vmulss_avx512f(auVar71,ZEXT416((uint)(fVar221 * -0.5)));
              auVar71 = vmulss_avx512f(auVar71,auVar71);
              auVar73 = vaddss_avx512f(auVar72,ZEXT416((uint)(auVar70._0_4_ * auVar71._0_4_)));
              auVar70 = vdpps_avx(local_820._0_16_,local_6b0,0x7f);
              auVar71 = vfnmadd231ss_fma(auVar68,auVar63,ZEXT416((uint)fVar219));
              auVar72 = vfnmadd231ss_fma(auVar70,auVar63,auVar67);
              auVar68 = vpermilps_avx(local_560._0_16_,0xff);
              fVar125 = fVar125 - auVar68._0_4_;
              auVar68 = vshufps_avx(auVar62,auVar62,0xff);
              auVar70 = vfmsub213ss_fma(auVar71,auVar73,auVar68);
              fVar220 = auVar72._0_4_ * auVar73._0_4_;
              auVar71 = vfmsub231ss_fma(ZEXT416((uint)(auVar67._0_4_ * auVar70._0_4_)),
                                        ZEXT416((uint)fVar219),ZEXT416((uint)fVar220));
              fVar239 = auVar71._0_4_;
              fVar233 = fVar233 - (auVar63._0_4_ * (fVar220 / fVar239) -
                                  fVar125 * (auVar67._0_4_ / fVar239));
              auVar235 = ZEXT464((uint)fVar233);
              fVar216 = fVar216 - (fVar125 * (fVar219 / fVar239) -
                                  auVar63._0_4_ * (auVar70._0_4_ / fVar239));
              auVar67 = vandps_avx(auVar63,auVar230);
              bVar58 = true;
              if (auVar67._0_4_ < auVar64._0_4_) {
                auVar70 = vfmadd231ss_fma(ZEXT416((uint)(auVar64._0_4_ + auVar234._0_4_)),local_610,
                                          ZEXT416(0x36000000));
                auVar67 = vandps_avx(auVar230,ZEXT416((uint)fVar125));
                if (auVar67._0_4_ < auVar70._0_4_) {
                  fVar216 = fVar216 + (float)local_600._0_4_;
                  if ((((fVar147 <= fVar216) &&
                       (fVar219 = *(float *)(ray + k * 4 + 0x80), fVar216 <= fVar219)) &&
                      (0.0 <= fVar233)) && (fVar233 <= 1.0)) {
                    auVar116._0_16_ = ZEXT816(0) << 0x20;
                    auVar115._4_28_ = auVar116._4_28_;
                    auVar115._0_4_ = fVar218;
                    auVar67 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar115._0_16_);
                    fVar218 = auVar67._0_4_;
                    auVar69 = vmulss_avx512f(auVar69,ZEXT416(0xbf000000));
                    pGVar3 = (context->scene->geometries).items[local_8e8].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar51 = true;
                      }
                      else {
                        fVar218 = fVar218 * 1.5 + auVar69._0_4_ * fVar218 * fVar218 * fVar218;
                        auVar162._0_4_ = local_820._0_4_ * fVar218;
                        auVar162._4_4_ = local_820._4_4_ * fVar218;
                        auVar162._8_4_ = local_820._8_4_ * fVar218;
                        auVar162._12_4_ = local_820._12_4_ * fVar218;
                        auVar68 = vfmadd213ps_fma(auVar68,auVar162,auVar62);
                        auVar69 = vshufps_avx(auVar162,auVar162,0xc9);
                        auVar67 = vshufps_avx(auVar62,auVar62,0xc9);
                        auVar163._0_4_ = auVar162._0_4_ * auVar67._0_4_;
                        auVar163._4_4_ = auVar162._4_4_ * auVar67._4_4_;
                        auVar163._8_4_ = auVar162._8_4_ * auVar67._8_4_;
                        auVar163._12_4_ = auVar162._12_4_ * auVar67._12_4_;
                        auVar62 = vfmsub231ps_fma(auVar163,auVar62,auVar69);
                        auVar69 = vshufps_avx(auVar62,auVar62,0xc9);
                        auVar67 = vshufps_avx(auVar68,auVar68,0xc9);
                        auVar62 = vshufps_avx(auVar62,auVar62,0xd2);
                        auVar136._0_4_ = auVar68._0_4_ * auVar62._0_4_;
                        auVar136._4_4_ = auVar68._4_4_ * auVar62._4_4_;
                        auVar136._8_4_ = auVar68._8_4_ * auVar62._8_4_;
                        auVar136._12_4_ = auVar68._12_4_ * auVar62._12_4_;
                        auVar69 = vfmsub231ps_fma(auVar136,auVar69,auVar67);
                        local_500 = (RTCHitN  [16])vshufps_avx(auVar69,auVar69,0x55);
                        auStack_4f0 = vshufps_avx(auVar69,auVar69,0xaa);
                        local_4e0 = auVar69._0_4_;
                        uStack_4dc = local_4e0;
                        uStack_4d8 = local_4e0;
                        uStack_4d4 = local_4e0;
                        local_4d0 = fVar233;
                        fStack_4cc = fVar233;
                        fStack_4c8 = fVar233;
                        fStack_4c4 = fVar233;
                        local_4c0 = ZEXT416(0) << 0x20;
                        local_4b0 = local_510._0_8_;
                        uStack_4a8 = local_510._8_8_;
                        local_4a0 = local_520;
                        vpcmpeqd_avx2(ZEXT1632(local_520),ZEXT1632(local_520));
                        uStack_48c = context->user->instID[0];
                        local_490 = uStack_48c;
                        uStack_488 = uStack_48c;
                        uStack_484 = uStack_48c;
                        uStack_480 = context->user->instPrimID[0];
                        uStack_47c = uStack_480;
                        uStack_478 = uStack_480;
                        uStack_474 = uStack_480;
                        *(float *)(ray + k * 4 + 0x80) = fVar216;
                        local_900 = local_530._0_8_;
                        uStack_8f8 = local_530._8_8_;
                        local_710.valid = (int *)&local_900;
                        local_710.geometryUserPtr = pGVar3->userPtr;
                        local_710.context = context->user;
                        local_710.hit = local_500;
                        local_710.N = 4;
                        local_710.ray = (RTCRayN *)ray;
                        if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar231 = ZEXT1664(auVar230);
                          auVar242 = ZEXT1664(local_820._0_16_);
                          (*pGVar3->occlusionFilterN)(&local_710);
                          auVar235 = ZEXT1664(ZEXT416((uint)fVar233));
                          auVar249 = ZEXT3264(local_7c0);
                          auVar258 = ZEXT3264(local_6e0);
                          auVar259 = ZEXT3264(local_7a0);
                          auVar257 = ZEXT3264(local_780);
                          auVar254 = ZEXT3264(local_8c0);
                          auVar256 = ZEXT3264(local_8a0);
                          auVar253 = ZEXT3264(local_880);
                          auVar251 = ZEXT3264(local_760);
                          auVar250 = ZEXT3264(local_740);
                          auVar252 = ZEXT3264(local_860);
                          auVar255 = ZEXT3264(local_840);
                        }
                        auVar45._8_8_ = uStack_8f8;
                        auVar45._0_8_ = local_900;
                        uVar60 = vptestmd_avx512vl(auVar45,auVar45);
                        if ((uVar60 & 0xf) == 0) {
                          bVar51 = false;
                        }
                        else {
                          p_Var4 = context->args->filter;
                          if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar231 = ZEXT1664(auVar231._0_16_);
                            auVar242 = ZEXT1664(auVar242._0_16_);
                            (*p_Var4)(&local_710);
                            auVar235 = ZEXT1664(ZEXT416((uint)fVar233));
                            auVar249 = ZEXT3264(local_7c0);
                            auVar258 = ZEXT3264(local_6e0);
                            auVar259 = ZEXT3264(local_7a0);
                            auVar257 = ZEXT3264(local_780);
                            auVar254 = ZEXT3264(local_8c0);
                            auVar256 = ZEXT3264(local_8a0);
                            auVar253 = ZEXT3264(local_880);
                            auVar251 = ZEXT3264(local_760);
                            auVar250 = ZEXT3264(local_740);
                            auVar252 = ZEXT3264(local_860);
                            auVar255 = ZEXT3264(local_840);
                          }
                          auVar46._8_8_ = uStack_8f8;
                          auVar46._0_8_ = local_900;
                          uVar60 = vptestmd_avx512vl(auVar46,auVar46);
                          uVar60 = uVar60 & 0xf;
                          auVar69 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar58 = (bool)((byte)uVar60 & 1);
                          bVar5 = (bool)((byte)(uVar60 >> 1) & 1);
                          bVar6 = (bool)((byte)(uVar60 >> 2) & 1);
                          bVar7 = SUB81(uVar60 >> 3,0);
                          *(uint *)(local_710.ray + 0x80) =
                               (uint)bVar58 * auVar69._0_4_ |
                               (uint)!bVar58 * *(int *)(local_710.ray + 0x80);
                          *(uint *)(local_710.ray + 0x84) =
                               (uint)bVar5 * auVar69._4_4_ |
                               (uint)!bVar5 * *(int *)(local_710.ray + 0x84);
                          *(uint *)(local_710.ray + 0x88) =
                               (uint)bVar6 * auVar69._8_4_ |
                               (uint)!bVar6 * *(int *)(local_710.ray + 0x88);
                          *(uint *)(local_710.ray + 0x8c) =
                               (uint)bVar7 * auVar69._12_4_ |
                               (uint)!bVar7 * *(int *)(local_710.ray + 0x8c);
                          bVar51 = (byte)uVar60 != 0;
                        }
                        if ((bool)bVar51 == false) {
                          *(float *)(ray + k * 4 + 0x80) = fVar219;
                        }
                      }
                      bVar58 = false;
                      goto LAB_01b51c1b;
                    }
                  }
                  bVar58 = false;
                  bVar51 = 0;
                }
              }
LAB_01b51c1b:
              if (!bVar58) goto LAB_01b51fd1;
              lVar57 = lVar57 + -1;
            } while (lVar57 != 0);
            bVar51 = 0;
LAB_01b51fd1:
            bVar55 = bVar55 | bVar51 & 1;
            auVar48._4_4_ = fStack_3fc;
            auVar48._0_4_ = local_400;
            auVar48._8_4_ = fStack_3f8;
            auVar48._12_4_ = fStack_3f4;
            auVar48._16_4_ = fStack_3f0;
            auVar48._20_4_ = fStack_3ec;
            auVar48._24_4_ = fStack_3e8;
            auVar48._28_4_ = fStack_3e4;
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar31._4_4_ = uVar1;
            auVar31._0_4_ = uVar1;
            auVar31._8_4_ = uVar1;
            auVar31._12_4_ = uVar1;
            auVar31._16_4_ = uVar1;
            auVar31._20_4_ = uVar1;
            auVar31._24_4_ = uVar1;
            auVar31._28_4_ = uVar1;
            uVar12 = vcmpps_avx512vl(auVar48,auVar31,2);
            bVar56 = bVar50 & bVar56 & (byte)uVar12;
          } while (bVar56 != 0);
        }
        uVar13 = vpcmpd_avx512vl(local_380,_local_420,1);
        uVar14 = vpcmpd_avx512vl(local_380,local_2e0,1);
        auVar165._0_4_ = (float)local_440._0_4_ + (float)local_1c0._0_4_;
        auVar165._4_4_ = (float)local_440._4_4_ + (float)local_1c0._4_4_;
        auVar165._8_4_ = fStack_438 + fStack_1b8;
        auVar165._12_4_ = fStack_434 + fStack_1b4;
        auVar165._16_4_ = fStack_430 + fStack_1b0;
        auVar165._20_4_ = fStack_42c + fStack_1ac;
        auVar165._24_4_ = fStack_428 + fStack_1a8;
        auVar165._28_4_ = fStack_424 + fStack_1a4;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar184._4_4_ = uVar1;
        auVar184._0_4_ = uVar1;
        auVar184._8_4_ = uVar1;
        auVar184._12_4_ = uVar1;
        auVar184._16_4_ = uVar1;
        auVar184._20_4_ = uVar1;
        auVar184._24_4_ = uVar1;
        auVar184._28_4_ = uVar1;
        uVar12 = vcmpps_avx512vl(auVar165,auVar184,2);
        bVar56 = (byte)local_8d0 & (byte)uVar14 & (byte)uVar12;
        auVar198._0_4_ = (float)local_440._0_4_ + (float)local_320._0_4_;
        auVar198._4_4_ = (float)local_440._4_4_ + (float)local_320._4_4_;
        auVar198._8_4_ = fStack_438 + fStack_318;
        auVar198._12_4_ = fStack_434 + fStack_314;
        auVar198._16_4_ = fStack_430 + fStack_310;
        auVar198._20_4_ = fStack_42c + fStack_30c;
        auVar198._24_4_ = fStack_428 + fStack_308;
        auVar198._28_4_ = fStack_424 + fStack_304;
        uVar12 = vcmpps_avx512vl(auVar198,auVar184,2);
        bVar53 = bVar53 & (byte)uVar13 & (byte)uVar12 | bVar56;
        prim = local_720;
        if (bVar53 != 0) {
          local_180[uVar52 * 0x60] = bVar53;
          bVar58 = (bool)(bVar56 >> 1 & 1);
          bVar5 = (bool)(bVar56 >> 2 & 1);
          bVar6 = (bool)(bVar56 >> 3 & 1);
          bVar7 = (bool)(bVar56 >> 4 & 1);
          bVar8 = (bool)(bVar56 >> 5 & 1);
          bVar9 = (bool)(bVar56 >> 6 & 1);
          auStack_160[uVar52 * 0x18] =
               (uint)(bVar56 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar56 & 1) * local_320._0_4_;
          auStack_160[uVar52 * 0x18 + 1] =
               (uint)bVar58 * local_1c0._4_4_ | (uint)!bVar58 * local_320._4_4_;
          auStack_160[uVar52 * 0x18 + 2] =
               (uint)bVar5 * (int)fStack_1b8 | (uint)!bVar5 * (int)fStack_318;
          auStack_160[uVar52 * 0x18 + 3] =
               (uint)bVar6 * (int)fStack_1b4 | (uint)!bVar6 * (int)fStack_314;
          auStack_160[uVar52 * 0x18 + 4] =
               (uint)bVar7 * (int)fStack_1b0 | (uint)!bVar7 * (int)fStack_310;
          local_140[uVar52 * 0x18 + -3] =
               (float)((uint)bVar8 * (int)fStack_1ac | (uint)!bVar8 * (int)fStack_30c);
          local_140[uVar52 * 0x18 + -2] =
               (float)((uint)bVar9 * (int)fStack_1a8 | (uint)!bVar9 * (int)fStack_308);
          local_140[uVar52 * 0x18 + -1] =
               (float)((uint)(bVar56 >> 7) * (int)fStack_1a4 |
                      (uint)!(bool)(bVar56 >> 7) * (int)fStack_304);
          uVar12 = vmovlps_avx(local_620);
          *(undefined8 *)(local_140 + uVar52 * 0x18) = uVar12;
          local_138[uVar52 * 0x18] = (int)local_8e0 + 1;
          uVar52 = (ulong)((int)uVar52 + 1);
        }
      }
      auVar199 = ZEXT3264(_DAT_02020f20);
      auVar185 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                     &
                                                  DAT_3f8000003f800000)))))));
    }
    do {
      if ((int)uVar52 == 0) {
        if (bVar55 != 0) {
          return bVar59;
        }
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar21._4_4_ = uVar1;
        auVar21._0_4_ = uVar1;
        auVar21._8_4_ = uVar1;
        auVar21._12_4_ = uVar1;
        uVar12 = vcmpps_avx512vl(local_390,auVar21,2);
        uVar61 = (uint)local_718 & (uint)uVar12;
        local_718 = (ulong)uVar61;
        bVar59 = uVar61 != 0;
        if (!bVar59) {
          return bVar59;
        }
        goto LAB_01b4f802;
      }
      uVar60 = (ulong)((int)uVar52 - 1);
      auVar77 = *(undefined1 (*) [32])(auStack_160 + uVar60 * 0x18);
      auVar166._0_4_ = auVar77._0_4_ + (float)local_440._0_4_;
      auVar166._4_4_ = auVar77._4_4_ + (float)local_440._4_4_;
      auVar166._8_4_ = auVar77._8_4_ + fStack_438;
      auVar166._12_4_ = auVar77._12_4_ + fStack_434;
      auVar166._16_4_ = auVar77._16_4_ + fStack_430;
      auVar166._20_4_ = auVar77._20_4_ + fStack_42c;
      auVar166._24_4_ = auVar77._24_4_ + fStack_428;
      auVar166._28_4_ = auVar77._28_4_ + fStack_424;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar32._4_4_ = uVar1;
      auVar32._0_4_ = uVar1;
      auVar32._8_4_ = uVar1;
      auVar32._12_4_ = uVar1;
      auVar32._16_4_ = uVar1;
      auVar32._20_4_ = uVar1;
      auVar32._24_4_ = uVar1;
      auVar32._28_4_ = uVar1;
      uVar12 = vcmpps_avx512vl(auVar166,auVar32,2);
      uVar61 = (uint)uVar12 & (uint)local_180[uVar60 * 0x60];
      bVar53 = (byte)uVar61;
      if (uVar61 != 0) {
        auVar167._8_4_ = 0x7f800000;
        auVar167._0_8_ = 0x7f8000007f800000;
        auVar167._12_4_ = 0x7f800000;
        auVar167._16_4_ = 0x7f800000;
        auVar167._20_4_ = 0x7f800000;
        auVar167._24_4_ = 0x7f800000;
        auVar167._28_4_ = 0x7f800000;
        auVar75 = vblendmps_avx512vl(auVar167,auVar77);
        auVar117._0_4_ =
             (uint)(bVar53 & 1) * auVar75._0_4_ | (uint)!(bool)(bVar53 & 1) * (int)auVar77._0_4_;
        bVar58 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar117._4_4_ = (uint)bVar58 * auVar75._4_4_ | (uint)!bVar58 * (int)auVar77._4_4_;
        bVar58 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar117._8_4_ = (uint)bVar58 * auVar75._8_4_ | (uint)!bVar58 * (int)auVar77._8_4_;
        bVar58 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar117._12_4_ = (uint)bVar58 * auVar75._12_4_ | (uint)!bVar58 * (int)auVar77._12_4_;
        bVar58 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar117._16_4_ = (uint)bVar58 * auVar75._16_4_ | (uint)!bVar58 * (int)auVar77._16_4_;
        bVar58 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar117._20_4_ = (uint)bVar58 * auVar75._20_4_ | (uint)!bVar58 * (int)auVar77._20_4_;
        bVar58 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar117._24_4_ = (uint)bVar58 * auVar75._24_4_ | (uint)!bVar58 * (int)auVar77._24_4_;
        auVar117._28_4_ =
             (uVar61 >> 7) * auVar75._28_4_ | (uint)!SUB41(uVar61 >> 7,0) * (int)auVar77._28_4_;
        auVar77 = vshufps_avx(auVar117,auVar117,0xb1);
        auVar77 = vminps_avx(auVar117,auVar77);
        auVar75 = vshufpd_avx(auVar77,auVar77,5);
        auVar77 = vminps_avx(auVar77,auVar75);
        auVar75 = vpermpd_avx2(auVar77,0x4e);
        auVar77 = vminps_avx(auVar77,auVar75);
        uVar12 = vcmpps_avx512vl(auVar117,auVar77,0);
        bVar56 = (byte)uVar12 & bVar53;
        if (bVar56 != 0) {
          uVar61 = (uint)bVar56;
        }
        fVar210 = local_140[uVar60 * 0x18 + 1];
        uVar118 = 0;
        for (; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x80000000) {
          uVar118 = uVar118 + 1;
        }
        local_8e0 = (ulong)local_138[uVar60 * 0x18];
        bVar56 = ~('\x01' << ((byte)uVar118 & 0x1f)) & bVar53;
        local_180[uVar60 * 0x60] = bVar56;
        auVar185 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
        uVar54 = uVar60;
        if (bVar56 != 0) {
          uVar54 = uVar52;
        }
        fVar216 = local_140[uVar60 * 0x18];
        auVar168._4_4_ = fVar216;
        auVar168._0_4_ = fVar216;
        auVar168._8_4_ = fVar216;
        auVar168._12_4_ = fVar216;
        auVar168._16_4_ = fVar216;
        auVar168._20_4_ = fVar216;
        auVar168._24_4_ = fVar216;
        auVar168._28_4_ = fVar216;
        fVar210 = fVar210 - fVar216;
        auVar146._4_4_ = fVar210;
        auVar146._0_4_ = fVar210;
        auVar146._8_4_ = fVar210;
        auVar146._12_4_ = fVar210;
        auVar146._16_4_ = fVar210;
        auVar146._20_4_ = fVar210;
        auVar146._24_4_ = fVar210;
        auVar146._28_4_ = fVar210;
        auVar69 = vfmadd132ps_fma(auVar146,auVar168,auVar199._0_32_);
        _local_500 = ZEXT1632(auVar69);
        local_620._8_8_ = 0;
        local_620._0_8_ = *(ulong *)(local_500 + (ulong)uVar118 * 4);
        uVar60 = uVar54;
      }
      uVar52 = uVar60;
    } while (bVar53 == 0);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }